

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::avx2::CurveNvIntersector1<4>::
     intersect_t<embree::avx2::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx2::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [28];
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  Primitive PVar7;
  uint uVar8;
  int iVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  ulong uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [28];
  uint uVar74;
  uint uVar75;
  uint uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  Primitive *pPVar80;
  long lVar81;
  undefined4 uVar82;
  undefined8 unaff_R14;
  ulong uVar83;
  long lVar84;
  undefined8 uVar85;
  float fVar102;
  vint4 bi_2;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  float fVar101;
  float fVar103;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar90 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  vint4 bi_1;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [64];
  float fVar125;
  float fVar126;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  vint4 ai_2;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  vint4 ai;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  vint4 bi;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  vint4 ai_1;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  float fVar182;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  undefined1 auVar189 [64];
  float fVar202;
  float fVar206;
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  undefined4 uVar207;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined4 uVar212;
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [16];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_774;
  ulong local_770;
  uint local_764;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined1 local_6f0 [8];
  undefined8 uStack_6e8;
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  Precalculations *local_6b8;
  RTCFilterFunctionNArguments local_6b0;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined8 local_5e0;
  undefined4 local_5d8;
  float local_5d4;
  undefined4 local_5d0;
  uint local_5cc;
  undefined4 local_5c8;
  uint local_5c4;
  uint local_5c0;
  RayHit *local_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [2] [32];
  Geometry *local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  int iStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  int local_200;
  int local_1fc;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  float local_180 [4];
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [32];
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar220 [16];
  
  PVar7 = prim[1];
  uVar83 = (ulong)(byte)PVar7;
  pPVar80 = prim + uVar83 * 0x19 + 0x16;
  fVar126 = *(float *)(prim + uVar83 * 0x19 + 0x12);
  auVar151 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + uVar83 * 0x19 + 6));
  auVar86._0_4_ = fVar126 * auVar151._0_4_;
  auVar86._4_4_ = fVar126 * auVar151._4_4_;
  auVar86._8_4_ = fVar126 * auVar151._8_4_;
  auVar86._12_4_ = fVar126 * auVar151._12_4_;
  auVar160._0_4_ = fVar126 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar160._4_4_ = fVar126 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar160._8_4_ = fVar126 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar160._12_4_ = fVar126 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar151 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 4 + 6)));
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 5 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 6 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0xb + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0xc + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0xd + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x12 + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x13 + 6)));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x14 + 6)));
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar219._4_4_ = auVar160._0_4_;
  auVar219._0_4_ = auVar160._0_4_;
  auVar219._8_4_ = auVar160._0_4_;
  auVar219._12_4_ = auVar160._0_4_;
  auVar108 = vshufps_avx(auVar160,auVar160,0x55);
  auVar87 = vshufps_avx(auVar160,auVar160,0xaa);
  fVar126 = auVar87._0_4_;
  auVar203._0_4_ = fVar126 * auVar14._0_4_;
  fVar125 = auVar87._4_4_;
  auVar203._4_4_ = fVar125 * auVar14._4_4_;
  fVar101 = auVar87._8_4_;
  auVar203._8_4_ = fVar101 * auVar14._8_4_;
  fVar102 = auVar87._12_4_;
  auVar203._12_4_ = fVar102 * auVar14._12_4_;
  auVar183._0_4_ = auVar17._0_4_ * fVar126;
  auVar183._4_4_ = auVar17._4_4_ * fVar125;
  auVar183._8_4_ = auVar17._8_4_ * fVar101;
  auVar183._12_4_ = auVar17._12_4_ * fVar102;
  auVar177._0_4_ = auVar127._0_4_ * fVar126;
  auVar177._4_4_ = auVar127._4_4_ * fVar125;
  auVar177._8_4_ = auVar127._8_4_ * fVar101;
  auVar177._12_4_ = auVar127._12_4_ * fVar102;
  auVar87 = vfmadd231ps_fma(auVar203,auVar108,auVar13);
  auVar128 = vfmadd231ps_fma(auVar183,auVar108,auVar16);
  auVar108 = vfmadd231ps_fma(auVar177,auVar88,auVar108);
  auVar142 = vfmadd231ps_fma(auVar87,auVar219,auVar151);
  auVar128 = vfmadd231ps_fma(auVar128,auVar219,auVar15);
  auVar148 = vfmadd231ps_fma(auVar108,auVar89,auVar219);
  auVar220._4_4_ = auVar86._0_4_;
  auVar220._0_4_ = auVar86._0_4_;
  auVar220._8_4_ = auVar86._0_4_;
  auVar220._12_4_ = auVar86._0_4_;
  auVar223 = ZEXT1664(auVar220);
  auVar108 = vshufps_avx(auVar86,auVar86,0x55);
  auVar87 = vshufps_avx(auVar86,auVar86,0xaa);
  fVar126 = auVar87._0_4_;
  auVar161._0_4_ = fVar126 * auVar14._0_4_;
  fVar125 = auVar87._4_4_;
  auVar161._4_4_ = fVar125 * auVar14._4_4_;
  fVar101 = auVar87._8_4_;
  auVar161._8_4_ = fVar101 * auVar14._8_4_;
  fVar102 = auVar87._12_4_;
  auVar161._12_4_ = fVar102 * auVar14._12_4_;
  auVar107._0_4_ = auVar17._0_4_ * fVar126;
  auVar107._4_4_ = auVar17._4_4_ * fVar125;
  auVar107._8_4_ = auVar17._8_4_ * fVar101;
  auVar107._12_4_ = auVar17._12_4_ * fVar102;
  auVar87._0_4_ = auVar127._0_4_ * fVar126;
  auVar87._4_4_ = auVar127._4_4_ * fVar125;
  auVar87._8_4_ = auVar127._8_4_ * fVar101;
  auVar87._12_4_ = auVar127._12_4_ * fVar102;
  auVar13 = vfmadd231ps_fma(auVar161,auVar108,auVar13);
  auVar14 = vfmadd231ps_fma(auVar107,auVar108,auVar16);
  auVar16 = vfmadd231ps_fma(auVar87,auVar108,auVar88);
  auVar17 = vfmadd231ps_fma(auVar13,auVar220,auVar151);
  auVar88 = vfmadd231ps_fma(auVar14,auVar220,auVar15);
  auVar127 = vfmadd231ps_fma(auVar16,auVar220,auVar89);
  local_270._8_4_ = 0x7fffffff;
  local_270._0_8_ = 0x7fffffff7fffffff;
  local_270._12_4_ = 0x7fffffff;
  auVar151 = vandps_avx(auVar142,local_270);
  auVar147._8_4_ = 0x219392ef;
  auVar147._0_8_ = 0x219392ef219392ef;
  auVar147._12_4_ = 0x219392ef;
  auVar151 = vcmpps_avx(auVar151,auVar147,1);
  auVar13 = vblendvps_avx(auVar142,auVar147,auVar151);
  auVar151 = vandps_avx(auVar128,local_270);
  auVar151 = vcmpps_avx(auVar151,auVar147,1);
  auVar14 = vblendvps_avx(auVar128,auVar147,auVar151);
  auVar151 = vandps_avx(local_270,auVar148);
  auVar151 = vcmpps_avx(auVar151,auVar147,1);
  auVar151 = vblendvps_avx(auVar148,auVar147,auVar151);
  auVar15 = vrcpps_avx(auVar13);
  auVar178._8_4_ = 0x3f800000;
  auVar178._0_8_ = 0x3f8000003f800000;
  auVar178._12_4_ = 0x3f800000;
  auVar13 = vfnmadd213ps_fma(auVar13,auVar15,auVar178);
  auVar15 = vfmadd132ps_fma(auVar13,auVar15,auVar15);
  auVar13 = vrcpps_avx(auVar14);
  auVar14 = vfnmadd213ps_fma(auVar14,auVar13,auVar178);
  auVar16 = vfmadd132ps_fma(auVar14,auVar13,auVar13);
  auVar13 = vrcpps_avx(auVar151);
  auVar14 = vfnmadd213ps_fma(auVar151,auVar13,auVar178);
  auVar151._8_8_ = 0;
  auVar151._0_8_ = *(ulong *)(prim + uVar83 * 7 + 6);
  auVar151 = vpmovsxwd_avx(auVar151);
  auVar89 = vfmadd132ps_fma(auVar14,auVar13,auVar13);
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar151 = vsubps_avx(auVar151,auVar17);
  auVar148._0_4_ = auVar15._0_4_ * auVar151._0_4_;
  auVar148._4_4_ = auVar15._4_4_ * auVar151._4_4_;
  auVar148._8_4_ = auVar15._8_4_ * auVar151._8_4_;
  auVar148._12_4_ = auVar15._12_4_ * auVar151._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar83 * 9 + 6);
  auVar151 = vpmovsxwd_avx(auVar13);
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar13 = vsubps_avx(auVar151,auVar17);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar83 * 0xe + 6);
  auVar151 = vpmovsxwd_avx(auVar14);
  auVar162._0_4_ = auVar15._0_4_ * auVar13._0_4_;
  auVar162._4_4_ = auVar15._4_4_ * auVar13._4_4_;
  auVar162._8_4_ = auVar15._8_4_ * auVar13._8_4_;
  auVar162._12_4_ = auVar15._12_4_ * auVar13._12_4_;
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar151 = vsubps_avx(auVar151,auVar88);
  auVar169._0_4_ = auVar16._0_4_ * auVar151._0_4_;
  auVar169._4_4_ = auVar16._4_4_ * auVar151._4_4_;
  auVar169._8_4_ = auVar16._8_4_ * auVar151._8_4_;
  auVar169._12_4_ = auVar16._12_4_ * auVar151._12_4_;
  auVar128._1_3_ = 0;
  auVar128[0] = PVar7;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 6);
  auVar151 = vpmovsxwd_avx(auVar15);
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar151 = vsubps_avx(auVar151,auVar88);
  auVar108._0_4_ = auVar16._0_4_ * auVar151._0_4_;
  auVar108._4_4_ = auVar16._4_4_ * auVar151._4_4_;
  auVar108._8_4_ = auVar16._8_4_ * auVar151._8_4_;
  auVar108._12_4_ = auVar16._12_4_ * auVar151._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar83 * 0x15 + 6);
  auVar151 = vpmovsxwd_avx(auVar16);
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar13 = vsubps_avx(auVar151,auVar127);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar83 * 0x17 + 6);
  auVar151 = vpmovsxwd_avx(auVar17);
  auVar142._0_4_ = auVar89._0_4_ * auVar13._0_4_;
  auVar142._4_4_ = auVar89._4_4_ * auVar13._4_4_;
  auVar142._8_4_ = auVar89._8_4_ * auVar13._8_4_;
  auVar142._12_4_ = auVar89._12_4_ * auVar13._12_4_;
  auVar151 = vcvtdq2ps_avx(auVar151);
  auVar151 = vsubps_avx(auVar151,auVar127);
  auVar88._0_4_ = auVar89._0_4_ * auVar151._0_4_;
  auVar88._4_4_ = auVar89._4_4_ * auVar151._4_4_;
  auVar88._8_4_ = auVar89._8_4_ * auVar151._8_4_;
  auVar88._12_4_ = auVar89._12_4_ * auVar151._12_4_;
  auVar151 = vpminsd_avx(auVar148,auVar162);
  auVar13 = vpminsd_avx(auVar169,auVar108);
  auVar151 = vmaxps_avx(auVar151,auVar13);
  auVar13 = vpminsd_avx(auVar142,auVar88);
  uVar82 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar184._4_4_ = uVar82;
  auVar184._0_4_ = uVar82;
  auVar184._8_4_ = uVar82;
  auVar184._12_4_ = uVar82;
  auVar13 = vmaxps_avx(auVar13,auVar184);
  auVar151 = vmaxps_avx(auVar151,auVar13);
  local_280._0_4_ = auVar151._0_4_ * 0.99999964;
  local_280._4_4_ = auVar151._4_4_ * 0.99999964;
  local_280._8_4_ = auVar151._8_4_ * 0.99999964;
  local_280._12_4_ = auVar151._12_4_ * 0.99999964;
  auVar151 = vpmaxsd_avx(auVar148,auVar162);
  auVar13 = vpmaxsd_avx(auVar169,auVar108);
  auVar151 = vminps_avx(auVar151,auVar13);
  auVar13 = vpmaxsd_avx(auVar142,auVar88);
  fVar126 = (ray->super_RayK<1>).tfar;
  auVar127._4_4_ = fVar126;
  auVar127._0_4_ = fVar126;
  auVar127._8_4_ = fVar126;
  auVar127._12_4_ = fVar126;
  auVar13 = vminps_avx(auVar13,auVar127);
  auVar151 = vminps_avx(auVar151,auVar13);
  auVar128[4] = PVar7;
  auVar128._5_3_ = 0;
  auVar128[8] = PVar7;
  auVar128._9_3_ = 0;
  auVar128[0xc] = PVar7;
  auVar128._13_3_ = 0;
  auVar13 = vpcmpgtd_avx(auVar128,_DAT_01f4ad30);
  auVar89._0_4_ = auVar151._0_4_ * 1.0000004;
  auVar89._4_4_ = auVar151._4_4_ * 1.0000004;
  auVar89._8_4_ = auVar151._8_4_ * 1.0000004;
  auVar89._12_4_ = auVar151._12_4_ * 1.0000004;
  auVar151 = vcmpps_avx(local_280,auVar89,2);
  auVar151 = vandps_avx(auVar151,auVar13);
  uVar82 = vmovmskps_avx(auVar151);
  uVar83 = CONCAT44((int)((ulong)unaff_R14 >> 0x20),uVar82);
  local_4c0[1]._0_8_ = mm_lookupmask_ps._16_8_;
  local_4c0[1]._8_8_ = mm_lookupmask_ps._24_8_;
  local_4c0[1]._16_8_ = mm_lookupmask_ps._16_8_;
  local_4c0[1]._24_8_ = mm_lookupmask_ps._24_8_;
  local_6b8 = pre;
  do {
    auVar165 = local_3a0;
    if (uVar83 == 0) {
      return;
    }
    lVar81 = 0;
    for (uVar79 = uVar83; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
      lVar81 = lVar81 + 1;
    }
    uVar83 = uVar83 - 1 & uVar83;
    uVar75 = *(uint *)(prim + lVar81 * 4 + 6);
    uVar77 = (ulong)(uint)((int)lVar81 << 6);
    uVar8 = *(uint *)(prim + 2);
    uVar79 = (ulong)uVar8;
    local_480 = (context->scene->geometries).items[uVar79].ptr;
    pPVar1 = pPVar80 + uVar77;
    local_700 = *(undefined8 *)pPVar1;
    uStack_6f8 = *(undefined8 *)(pPVar1 + 8);
    if (uVar83 != 0) {
      uVar78 = uVar83 - 1 & uVar83;
      for (uVar21 = uVar83; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
      }
      if (uVar78 != 0) {
        for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
        }
      }
    }
    local_6d0 = *(undefined1 (*) [16])(pPVar80 + uVar77 + 0x10);
    auVar128 = local_6d0;
    local_6e0 = *(undefined1 (*) [16])(pPVar80 + uVar77 + 0x20);
    _local_6f0 = *(undefined1 (*) [16])(pPVar80 + uVar77 + 0x30);
    iVar9 = (int)local_480[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar4 = (ray->super_RayK<1>).org.field_0;
    auVar13 = vsubps_avx(*(undefined1 (*) [16])pPVar1,(undefined1  [16])aVar4);
    uVar82 = auVar13._0_4_;
    auVar143._4_4_ = uVar82;
    auVar143._0_4_ = uVar82;
    auVar143._8_4_ = uVar82;
    auVar143._12_4_ = uVar82;
    auVar151 = vshufps_avx(auVar13,auVar13,0x55);
    auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
    aVar5 = (pre->ray_space).vx.field_0;
    aVar6 = (pre->ray_space).vy.field_0;
    fVar126 = (pre->ray_space).vz.field_0.m128[0];
    fVar125 = (pre->ray_space).vz.field_0.m128[1];
    fVar101 = (pre->ray_space).vz.field_0.m128[2];
    fVar102 = (pre->ray_space).vz.field_0.m128[3];
    auVar163._0_4_ = auVar13._0_4_ * fVar126;
    auVar163._4_4_ = auVar13._4_4_ * fVar125;
    auVar163._8_4_ = auVar13._8_4_ * fVar101;
    auVar163._12_4_ = auVar13._12_4_ * fVar102;
    auVar151 = vfmadd231ps_fma(auVar163,(undefined1  [16])aVar6,auVar151);
    auVar17 = vfmadd231ps_fma(auVar151,(undefined1  [16])aVar5,auVar143);
    auVar151 = vblendps_avx(auVar17,*(undefined1 (*) [16])pPVar1,8);
    auVar14 = vsubps_avx(local_6d0,(undefined1  [16])aVar4);
    uVar82 = auVar14._0_4_;
    auVar164._4_4_ = uVar82;
    auVar164._0_4_ = uVar82;
    auVar164._8_4_ = uVar82;
    auVar164._12_4_ = uVar82;
    auVar13 = vshufps_avx(auVar14,auVar14,0x55);
    auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
    auVar179._0_4_ = auVar14._0_4_ * fVar126;
    auVar179._4_4_ = auVar14._4_4_ * fVar125;
    auVar179._8_4_ = auVar14._8_4_ * fVar101;
    auVar179._12_4_ = auVar14._12_4_ * fVar102;
    auVar13 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar6,auVar13);
    auVar89 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar5,auVar164);
    auVar13 = vblendps_avx(auVar89,local_6d0,8);
    auVar87 = local_6e0;
    auVar15 = vsubps_avx(local_6e0,(undefined1  [16])aVar4);
    uVar82 = auVar15._0_4_;
    auVar170._4_4_ = uVar82;
    auVar170._0_4_ = uVar82;
    auVar170._8_4_ = uVar82;
    auVar170._12_4_ = uVar82;
    auVar14 = vshufps_avx(auVar15,auVar15,0x55);
    auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
    auVar213._0_4_ = auVar15._0_4_ * fVar126;
    auVar213._4_4_ = auVar15._4_4_ * fVar125;
    auVar213._8_4_ = auVar15._8_4_ * fVar101;
    auVar213._12_4_ = auVar15._12_4_ * fVar102;
    auVar14 = vfmadd231ps_fma(auVar213,(undefined1  [16])aVar6,auVar14);
    auVar88 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar5,auVar170);
    auVar14 = vblendps_avx(auVar88,local_6e0,8);
    auVar108 = _local_6f0;
    auVar16 = vsubps_avx(_local_6f0,(undefined1  [16])aVar4);
    uVar82 = auVar16._0_4_;
    auVar180._4_4_ = uVar82;
    auVar180._0_4_ = uVar82;
    auVar180._8_4_ = uVar82;
    auVar180._12_4_ = uVar82;
    auVar15 = vshufps_avx(auVar16,auVar16,0x55);
    auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
    auVar216._0_4_ = auVar16._0_4_ * fVar126;
    auVar216._4_4_ = auVar16._4_4_ * fVar125;
    auVar216._8_4_ = auVar16._8_4_ * fVar101;
    auVar216._12_4_ = auVar16._12_4_ * fVar102;
    auVar15 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar6,auVar15);
    auVar127 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar5,auVar180);
    auVar15 = vblendps_avx(auVar127,_local_6f0,8);
    auVar151 = vandps_avx(auVar151,local_270);
    auVar13 = vandps_avx(auVar13,local_270);
    auVar16 = vmaxps_avx(auVar151,auVar13);
    auVar151 = vandps_avx(auVar14,local_270);
    auVar13 = vandps_avx(auVar15,local_270);
    auVar151 = vmaxps_avx(auVar151,auVar13);
    auVar151 = vmaxps_avx(auVar16,auVar151);
    auVar13 = vmovshdup_avx(auVar151);
    auVar13 = vmaxss_avx(auVar13,auVar151);
    auVar151 = vshufpd_avx(auVar151,auVar151,1);
    auVar151 = vmaxss_avx(auVar151,auVar13);
    lVar81 = (long)iVar9 * 0x44;
    auVar13 = vmovshdup_avx(auVar17);
    uVar85 = auVar13._0_8_;
    local_3c0._8_8_ = uVar85;
    local_3c0._0_8_ = uVar85;
    local_3c0._16_8_ = uVar85;
    local_3c0._24_8_ = uVar85;
    auVar13 = vmovshdup_avx(auVar89);
    uVar85 = auVar13._0_8_;
    local_3e0._8_8_ = uVar85;
    local_3e0._0_8_ = uVar85;
    local_3e0._16_8_ = uVar85;
    local_3e0._24_8_ = uVar85;
    auVar95 = *(undefined1 (*) [32])(bspline_basis0 + lVar81 + 0x908);
    uVar212 = auVar88._0_4_;
    local_4e0._4_4_ = uVar212;
    local_4e0._0_4_ = uVar212;
    local_4e0._8_4_ = uVar212;
    local_4e0._12_4_ = uVar212;
    local_4e0._16_4_ = uVar212;
    local_4e0._20_4_ = uVar212;
    local_4e0._24_4_ = uVar212;
    local_4e0._28_4_ = uVar212;
    auVar13 = vmovshdup_avx(auVar88);
    uVar85 = auVar13._0_8_;
    local_600._8_8_ = uVar85;
    local_600._0_8_ = uVar85;
    local_600._16_8_ = uVar85;
    local_600._24_8_ = uVar85;
    fVar125 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar81 + 0xd8c);
    fVar101 = *(float *)(bspline_basis0 + lVar81 + 0xd90);
    fVar102 = *(float *)(bspline_basis0 + lVar81 + 0xd94);
    fVar103 = *(float *)(bspline_basis0 + lVar81 + 0xd98);
    fVar104 = *(float *)(bspline_basis0 + lVar81 + 0xd9c);
    fVar105 = *(float *)(bspline_basis0 + lVar81 + 0xda0);
    fVar106 = *(float *)(bspline_basis0 + lVar81 + 0xda4);
    auVar73 = *(undefined1 (*) [28])(bspline_basis0 + lVar81 + 0xd8c);
    auVar13 = vmovshdup_avx(auVar127);
    local_500 = auVar13._0_8_;
    local_520 = auVar127._0_4_;
    auVar97._0_4_ = fVar125 * local_520;
    auVar97._4_4_ = fVar101 * local_520;
    auVar97._8_4_ = fVar102 * local_520;
    auVar97._12_4_ = fVar103 * local_520;
    auVar97._16_4_ = fVar104 * local_520;
    auVar97._20_4_ = fVar105 * local_520;
    auVar97._24_4_ = fVar106 * local_520;
    auVar97._28_4_ = 0;
    auVar14 = vfmadd231ps_fma(auVar97,auVar95,local_4e0);
    fVar202 = auVar13._0_4_;
    auVar217._0_4_ = fVar202 * fVar125;
    fVar206 = auVar13._4_4_;
    auVar217._4_4_ = fVar206 * fVar101;
    auVar217._8_4_ = fVar202 * fVar102;
    auVar217._12_4_ = fVar206 * fVar103;
    auVar217._16_4_ = fVar202 * fVar104;
    auVar217._20_4_ = fVar206 * fVar105;
    auVar217._28_36_ = auVar223._28_36_;
    auVar217._24_4_ = fVar202 * fVar106;
    auVar13 = vfmadd231ps_fma(auVar217._0_32_,auVar95,local_600);
    auVar97 = *(undefined1 (*) [32])(bspline_basis0 + lVar81 + 0x484);
    uVar207 = auVar89._0_4_;
    local_560._4_4_ = uVar207;
    local_560._0_4_ = uVar207;
    local_560._8_4_ = uVar207;
    local_560._12_4_ = uVar207;
    local_560._16_4_ = uVar207;
    local_560._20_4_ = uVar207;
    local_560._24_4_ = uVar207;
    local_560._28_4_ = uVar207;
    auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar97,local_560);
    auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar97,local_3e0);
    auVar116 = *(undefined1 (*) [32])(bspline_basis0 + lVar81);
    uVar82 = auVar17._0_4_;
    local_680._4_4_ = uVar82;
    local_680._0_4_ = uVar82;
    local_680._8_4_ = uVar82;
    local_680._12_4_ = uVar82;
    local_680._16_4_ = uVar82;
    local_680._20_4_ = uVar82;
    local_680._24_4_ = uVar82;
    local_680._28_4_ = uVar82;
    auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar116,local_680);
    auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar116,local_3c0);
    auVar139 = *(undefined1 (*) [32])(bspline_basis1 + lVar81 + 0x908);
    fVar191 = *(float *)(bspline_basis1 + lVar81 + 0xd8c);
    fVar193 = *(float *)(bspline_basis1 + lVar81 + 0xd90);
    fVar195 = *(float *)(bspline_basis1 + lVar81 + 0xd94);
    fVar197 = *(float *)(bspline_basis1 + lVar81 + 0xd98);
    fVar199 = *(float *)(bspline_basis1 + lVar81 + 0xd9c);
    fVar201 = *(float *)(bspline_basis1 + lVar81 + 0xda0);
    fVar68 = *(float *)(bspline_basis1 + lVar81 + 0xda4);
    fStack_51c = local_520;
    fStack_518 = local_520;
    fStack_514 = local_520;
    fStack_510 = local_520;
    fStack_50c = local_520;
    fStack_508 = local_520;
    fStack_504 = local_520;
    auVar138._4_4_ = fVar193 * local_520;
    auVar138._0_4_ = fVar191 * local_520;
    auVar138._8_4_ = fVar195 * local_520;
    auVar138._12_4_ = fVar197 * local_520;
    auVar138._16_4_ = fVar199 * local_520;
    auVar138._20_4_ = fVar201 * local_520;
    auVar138._24_4_ = fVar68 * local_520;
    auVar138._28_4_ = local_520;
    auVar15 = vfmadd231ps_fma(auVar138,auVar139,local_4e0);
    uStack_4f8 = local_500;
    uStack_4f0 = local_500;
    uStack_4e8 = local_500;
    auVar96._4_4_ = fVar206 * fVar193;
    auVar96._0_4_ = fVar202 * fVar191;
    auVar96._8_4_ = fVar202 * fVar195;
    auVar96._12_4_ = fVar206 * fVar197;
    auVar96._16_4_ = fVar202 * fVar199;
    auVar96._20_4_ = fVar206 * fVar201;
    auVar96._24_4_ = fVar202 * fVar68;
    auVar96._28_4_ = uVar212;
    auVar16 = vfmadd231ps_fma(auVar96,auVar139,local_600);
    auVar138 = *(undefined1 (*) [32])(bspline_basis1 + lVar81 + 0x484);
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar138,local_560);
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar138,local_3e0);
    auVar96 = *(undefined1 (*) [32])(bspline_basis1 + lVar81);
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar96,local_680);
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar96,local_3c0);
    auVar91 = ZEXT1632(auVar15);
    auVar109 = ZEXT1632(auVar14);
    auVar18 = vsubps_avx(auVar91,auVar109);
    local_2c0 = ZEXT1632(auVar16);
    _local_440 = ZEXT1632(auVar13);
    auVar173 = vsubps_avx(local_2c0,_local_440);
    auVar92._0_4_ = auVar13._0_4_ * auVar18._0_4_;
    auVar92._4_4_ = auVar13._4_4_ * auVar18._4_4_;
    auVar92._8_4_ = auVar13._8_4_ * auVar18._8_4_;
    auVar92._12_4_ = auVar13._12_4_ * auVar18._12_4_;
    auVar92._16_4_ = auVar18._16_4_ * 0.0;
    auVar92._20_4_ = auVar18._20_4_ * 0.0;
    auVar92._24_4_ = auVar18._24_4_ * 0.0;
    auVar92._28_4_ = 0;
    fVar182 = auVar173._0_4_;
    auVar110._0_4_ = fVar182 * auVar14._0_4_;
    fVar190 = auVar173._4_4_;
    auVar110._4_4_ = fVar190 * auVar14._4_4_;
    fVar192 = auVar173._8_4_;
    auVar110._8_4_ = fVar192 * auVar14._8_4_;
    fVar194 = auVar173._12_4_;
    auVar110._12_4_ = fVar194 * auVar14._12_4_;
    fVar196 = auVar173._16_4_;
    auVar110._16_4_ = fVar196 * 0.0;
    fVar198 = auVar173._20_4_;
    auVar110._20_4_ = fVar198 * 0.0;
    fVar200 = auVar173._24_4_;
    auVar110._24_4_ = fVar200 * 0.0;
    auVar110._28_4_ = 0;
    auVar92 = vsubps_avx(auVar92,auVar110);
    auVar13 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
    uVar85 = auVar13._0_8_;
    local_80._8_8_ = uVar85;
    local_80._0_8_ = uVar85;
    local_80._16_8_ = uVar85;
    local_80._24_8_ = uVar85;
    auVar14 = vpermilps_avx(local_6d0,0xff);
    uVar85 = auVar14._0_8_;
    local_a0._8_8_ = uVar85;
    local_a0._0_8_ = uVar85;
    local_a0._16_8_ = uVar85;
    local_a0._24_8_ = uVar85;
    auVar14 = vpermilps_avx(local_6e0,0xff);
    uVar85 = auVar14._0_8_;
    local_c0._8_8_ = uVar85;
    local_c0._0_8_ = uVar85;
    local_c0._16_8_ = uVar85;
    local_c0._24_8_ = uVar85;
    auVar14 = vpermilps_avx(_local_6f0,0xff);
    local_e0 = auVar14._0_8_;
    fVar126 = auVar14._0_4_;
    auVar171._0_4_ = fVar125 * fVar126;
    fVar125 = auVar14._4_4_;
    auVar171._4_4_ = fVar101 * fVar125;
    auVar171._8_4_ = fVar102 * fVar126;
    auVar171._12_4_ = fVar103 * fVar125;
    auVar171._16_4_ = fVar104 * fVar126;
    auVar171._20_4_ = fVar105 * fVar125;
    auVar171._24_4_ = fVar106 * fVar126;
    auVar171._28_4_ = 0;
    auVar14 = vfmadd231ps_fma(auVar171,local_c0,auVar95);
    auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar97,local_a0);
    auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar116,local_80);
    uStack_d8 = local_e0;
    uStack_d0 = local_e0;
    uStack_c8 = local_e0;
    auVar12._4_4_ = fVar193 * fVar125;
    auVar12._0_4_ = fVar191 * fVar126;
    auVar12._8_4_ = fVar195 * fVar126;
    auVar12._12_4_ = fVar197 * fVar125;
    auVar12._16_4_ = fVar199 * fVar126;
    auVar12._20_4_ = fVar201 * fVar125;
    auVar12._24_4_ = fVar68 * fVar126;
    auVar12._28_4_ = auVar116._28_4_;
    auVar15 = vfmadd231ps_fma(auVar12,auVar139,local_c0);
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar138,local_a0);
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar96,local_80);
    auVar204._4_4_ = fVar190 * fVar190;
    auVar204._0_4_ = fVar182 * fVar182;
    auVar204._8_4_ = fVar192 * fVar192;
    auVar204._12_4_ = fVar194 * fVar194;
    auVar204._16_4_ = fVar196 * fVar196;
    auVar204._20_4_ = fVar198 * fVar198;
    auVar204._24_4_ = fVar200 * fVar200;
    auVar204._28_4_ = auVar13._4_4_;
    auVar13 = vfmadd231ps_fma(auVar204,auVar18,auVar18);
    auVar12 = vmaxps_avx(ZEXT1632(auVar14),ZEXT1632(auVar15));
    auVar19._4_4_ = auVar13._4_4_ * auVar12._4_4_ * auVar12._4_4_;
    auVar19._0_4_ = auVar13._0_4_ * auVar12._0_4_ * auVar12._0_4_;
    auVar19._8_4_ = auVar13._8_4_ * auVar12._8_4_ * auVar12._8_4_;
    auVar19._12_4_ = auVar13._12_4_ * auVar12._12_4_ * auVar12._12_4_;
    auVar19._16_4_ = auVar12._16_4_ * auVar12._16_4_ * 0.0;
    auVar19._20_4_ = auVar12._20_4_ * auVar12._20_4_ * 0.0;
    auVar19._24_4_ = auVar12._24_4_ * auVar12._24_4_ * 0.0;
    auVar19._28_4_ = auVar12._28_4_;
    auVar20._4_4_ = auVar92._4_4_ * auVar92._4_4_;
    auVar20._0_4_ = auVar92._0_4_ * auVar92._0_4_;
    auVar20._8_4_ = auVar92._8_4_ * auVar92._8_4_;
    auVar20._12_4_ = auVar92._12_4_ * auVar92._12_4_;
    auVar20._16_4_ = auVar92._16_4_ * auVar92._16_4_;
    auVar20._20_4_ = auVar92._20_4_ * auVar92._20_4_;
    auVar20._24_4_ = auVar92._24_4_ * auVar92._24_4_;
    auVar20._28_4_ = auVar92._28_4_;
    auVar12 = vcmpps_avx(auVar20,auVar19,2);
    fVar126 = auVar151._0_4_ * 4.7683716e-07;
    local_740._0_16_ = ZEXT416((uint)fVar126);
    auVar111._0_4_ = (float)iVar9;
    local_3a0._4_12_ = auVar127._4_12_;
    local_3a0._0_4_ = auVar111._0_4_;
    local_3a0._16_16_ = auVar165._16_16_;
    auVar111._4_4_ = auVar111._0_4_;
    auVar111._8_4_ = auVar111._0_4_;
    auVar111._12_4_ = auVar111._0_4_;
    auVar111._16_4_ = auVar111._0_4_;
    auVar111._20_4_ = auVar111._0_4_;
    auVar111._24_4_ = auVar111._0_4_;
    auVar111._28_4_ = auVar111._0_4_;
    auVar165 = vcmpps_avx(_DAT_01f7b060,auVar111,1);
    auVar151 = vpermilps_avx(auVar17,0xaa);
    uVar85 = auVar151._0_8_;
    auVar144._8_8_ = uVar85;
    auVar144._0_8_ = uVar85;
    auVar144._16_8_ = uVar85;
    auVar144._24_8_ = uVar85;
    auVar151 = vpermilps_avx(auVar89,0xaa);
    uVar85 = auVar151._0_8_;
    local_2a0._8_8_ = uVar85;
    local_2a0._0_8_ = uVar85;
    local_2a0._16_8_ = uVar85;
    local_2a0._24_8_ = uVar85;
    auVar13 = vpermilps_avx(auVar88,0xaa);
    uVar85 = auVar13._0_8_;
    local_5a0._8_8_ = uVar85;
    local_5a0._0_8_ = uVar85;
    local_5a0._16_8_ = uVar85;
    local_5a0._24_8_ = uVar85;
    auVar151 = vshufps_avx(auVar127,auVar127,0xaa);
    uVar85 = auVar151._0_8_;
    register0x00001548 = uVar85;
    local_540 = uVar85;
    register0x00001550 = uVar85;
    register0x00001558 = uVar85;
    auVar217 = ZEXT3264(_local_540);
    auVar92 = auVar165 & auVar12;
    local_640._0_16_ = vpermilps_avx((undefined1  [16])aVar4,0xff);
    auVar204 = local_640;
    local_660._0_4_ = iVar9;
    local_640 = auVar204;
    if ((((((((auVar92 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar92 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar92 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar92 >> 0x7f,0) == '\0') &&
          (auVar92 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar92 >> 0xbf,0) == '\0') &&
        (auVar92 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar92[0x1f]) {
      auVar210 = ZEXT3264(local_5a0);
      auVar205 = ZEXT3264(local_600);
      auVar189 = ZEXT3264(local_560);
      auVar223 = ZEXT3264(local_680);
      _local_6f0 = auVar108;
      local_6e0 = auVar87;
      local_6d0 = auVar128;
    }
    else {
      local_2e0 = vandps_avx(auVar165,auVar12);
      fVar182 = auVar151._0_4_;
      fVar190 = auVar151._4_4_;
      auVar165._4_4_ = fVar190 * fVar193;
      auVar165._0_4_ = fVar182 * fVar191;
      auVar165._8_4_ = fVar182 * fVar195;
      auVar165._12_4_ = fVar190 * fVar197;
      auVar165._16_4_ = fVar182 * fVar199;
      auVar165._20_4_ = fVar190 * fVar201;
      auVar165._24_4_ = fVar182 * fVar68;
      auVar165._28_4_ = local_2e0._28_4_;
      auVar151 = vfmadd213ps_fma(auVar139,local_5a0,auVar165);
      auVar151 = vfmadd213ps_fma(auVar138,local_2a0,ZEXT1632(auVar151));
      auVar151 = vfmadd213ps_fma(auVar96,auVar144,ZEXT1632(auVar151));
      _local_300 = ZEXT1632(auVar151);
      local_460._0_4_ = auVar73._0_4_;
      local_460._4_4_ = auVar73._4_4_;
      fStack_458 = auVar73._8_4_;
      fStack_454 = auVar73._12_4_;
      fStack_450 = auVar73._16_4_;
      fStack_44c = auVar73._20_4_;
      fStack_448 = auVar73._24_4_;
      auVar139._4_4_ = fVar190 * (float)local_460._4_4_;
      auVar139._0_4_ = fVar182 * (float)local_460._0_4_;
      auVar139._8_4_ = fVar182 * fStack_458;
      auVar139._12_4_ = fVar190 * fStack_454;
      auVar139._16_4_ = fVar182 * fStack_450;
      auVar139._20_4_ = fVar190 * fStack_44c;
      auVar139._24_4_ = fVar182 * fStack_448;
      auVar139._28_4_ = local_2e0._28_4_;
      auVar151 = vfmadd213ps_fma(auVar95,local_5a0,auVar139);
      auVar151 = vfmadd213ps_fma(auVar97,local_2a0,ZEXT1632(auVar151));
      auVar165 = *(undefined1 (*) [32])(bspline_basis0 + lVar81 + 0x1210);
      auVar95 = *(undefined1 (*) [32])(bspline_basis0 + lVar81 + 0x1694);
      local_620 = auVar144;
      auVar97 = *(undefined1 (*) [32])(bspline_basis0 + lVar81 + 0x1b18);
      _local_460 = auVar18;
      fVar125 = *(float *)(bspline_basis0 + lVar81 + 0x1f9c);
      fVar101 = *(float *)(bspline_basis0 + lVar81 + 0x1fa0);
      fVar102 = *(float *)(bspline_basis0 + lVar81 + 0x1fa4);
      fVar103 = *(float *)(bspline_basis0 + lVar81 + 0x1fa8);
      fVar104 = *(float *)(bspline_basis0 + lVar81 + 0x1fac);
      fVar105 = *(float *)(bspline_basis0 + lVar81 + 0x1fb0);
      fVar106 = *(float *)(bspline_basis0 + lVar81 + 0x1fb4);
      auVar137._0_4_ = fVar125 * local_520;
      auVar137._4_4_ = fVar101 * local_520;
      auVar137._8_4_ = fVar102 * local_520;
      auVar137._12_4_ = fVar103 * local_520;
      auVar137._16_4_ = fVar104 * local_520;
      auVar137._20_4_ = fVar105 * local_520;
      auVar137._24_4_ = fVar106 * local_520;
      auVar137._28_4_ = 0;
      auVar22._4_4_ = fVar206 * fVar101;
      auVar22._0_4_ = fVar202 * fVar125;
      auVar22._8_4_ = fVar202 * fVar102;
      auVar22._12_4_ = fVar206 * fVar103;
      auVar22._16_4_ = fVar202 * fVar104;
      auVar22._20_4_ = fVar206 * fVar105;
      auVar22._24_4_ = fVar202 * fVar106;
      auVar22._28_4_ = auVar18._28_4_;
      auVar23._4_4_ = fVar190 * fVar101;
      auVar23._0_4_ = fVar182 * fVar125;
      auVar23._8_4_ = fVar182 * fVar102;
      auVar23._12_4_ = fVar190 * fVar103;
      auVar23._16_4_ = fVar182 * fVar104;
      auVar23._20_4_ = fVar190 * fVar105;
      auVar23._24_4_ = fVar182 * fVar106;
      auVar23._28_4_ = *(undefined4 *)(bspline_basis0 + lVar81 + 0x1fb8);
      auVar16 = vfmadd231ps_fma(auVar137,auVar97,local_4e0);
      auVar17 = vfmadd231ps_fma(auVar22,auVar97,local_600);
      auVar89 = vfmadd231ps_fma(auVar23,local_5a0,auVar97);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar95,local_560);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar95,local_3e0);
      auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),local_2a0,auVar95);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar165,local_680);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar165,local_3c0);
      auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar165,auVar144);
      fVar125 = *(float *)(bspline_basis1 + lVar81 + 0x1f9c);
      fVar101 = *(float *)(bspline_basis1 + lVar81 + 0x1fa0);
      fVar102 = *(float *)(bspline_basis1 + lVar81 + 0x1fa4);
      fVar103 = *(float *)(bspline_basis1 + lVar81 + 0x1fa8);
      fVar104 = *(float *)(bspline_basis1 + lVar81 + 0x1fac);
      fVar105 = *(float *)(bspline_basis1 + lVar81 + 0x1fb0);
      fVar106 = *(float *)(bspline_basis1 + lVar81 + 0x1fb4);
      auVar95._4_4_ = local_520 * fVar101;
      auVar95._0_4_ = local_520 * fVar125;
      auVar95._8_4_ = local_520 * fVar102;
      auVar95._12_4_ = local_520 * fVar103;
      auVar95._16_4_ = local_520 * fVar104;
      auVar95._20_4_ = local_520 * fVar105;
      auVar95._24_4_ = local_520 * fVar106;
      auVar95._28_4_ = auVar97._28_4_;
      auVar24._4_4_ = fVar206 * fVar101;
      auVar24._0_4_ = fVar202 * fVar125;
      auVar24._8_4_ = fVar202 * fVar102;
      auVar24._12_4_ = fVar206 * fVar103;
      auVar24._16_4_ = fVar202 * fVar104;
      auVar24._20_4_ = fVar206 * fVar105;
      auVar24._24_4_ = fVar202 * fVar106;
      auVar24._28_4_ = auVar13._4_4_;
      auVar25._4_4_ = fVar190 * fVar101;
      auVar25._0_4_ = fVar182 * fVar125;
      auVar25._8_4_ = fVar182 * fVar102;
      auVar25._12_4_ = fVar190 * fVar103;
      auVar25._16_4_ = fVar182 * fVar104;
      auVar25._20_4_ = fVar190 * fVar105;
      auVar25._24_4_ = fVar182 * fVar106;
      auVar25._28_4_ = fVar206;
      auVar165 = *(undefined1 (*) [32])(bspline_basis1 + lVar81 + 0x1b18);
      auVar13 = vfmadd231ps_fma(auVar95,auVar165,local_4e0);
      auVar88 = vfmadd231ps_fma(auVar24,auVar165,local_600);
      auVar127 = vfmadd231ps_fma(auVar25,local_5a0,auVar165);
      auVar165 = *(undefined1 (*) [32])(bspline_basis1 + lVar81 + 0x1694);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar165,local_560);
      auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar165,local_3e0);
      auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),local_2a0,auVar165);
      auVar165 = *(undefined1 (*) [32])(bspline_basis1 + lVar81 + 0x1210);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar165,local_680);
      auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar165,local_3c0);
      auVar112._8_4_ = 0x7fffffff;
      auVar112._0_8_ = 0x7fffffff7fffffff;
      auVar112._12_4_ = 0x7fffffff;
      auVar112._16_4_ = 0x7fffffff;
      auVar112._20_4_ = 0x7fffffff;
      auVar112._24_4_ = 0x7fffffff;
      auVar112._28_4_ = 0x7fffffff;
      auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar144,auVar165);
      auVar165 = vandps_avx(ZEXT1632(auVar16),auVar112);
      auVar95 = vandps_avx(ZEXT1632(auVar17),auVar112);
      auVar95 = vmaxps_avx(auVar165,auVar95);
      auVar165 = vandps_avx(ZEXT1632(auVar89),auVar112);
      auVar165 = vmaxps_avx(auVar95,auVar165);
      auVar185._4_4_ = fVar126;
      auVar185._0_4_ = fVar126;
      auVar185._8_4_ = fVar126;
      auVar185._12_4_ = fVar126;
      auVar185._16_4_ = fVar126;
      auVar185._20_4_ = fVar126;
      auVar185._24_4_ = fVar126;
      auVar185._28_4_ = fVar126;
      auVar165 = vcmpps_avx(auVar165,auVar185,1);
      auVar97 = vblendvps_avx(ZEXT1632(auVar16),auVar18,auVar165);
      auVar139 = vblendvps_avx(ZEXT1632(auVar17),auVar173,auVar165);
      auVar165 = vandps_avx(ZEXT1632(auVar13),auVar112);
      auVar95 = vandps_avx(ZEXT1632(auVar88),auVar112);
      auVar95 = vmaxps_avx(auVar165,auVar95);
      auVar165 = vandps_avx(ZEXT1632(auVar127),auVar112);
      auVar165 = vmaxps_avx(auVar95,auVar165);
      auVar95 = vcmpps_avx(auVar165,auVar185,1);
      auVar165 = vblendvps_avx(ZEXT1632(auVar13),auVar18,auVar95);
      auVar95 = vblendvps_avx(ZEXT1632(auVar88),auVar173,auVar95);
      auVar151 = vfmadd213ps_fma(auVar116,auVar144,ZEXT1632(auVar151));
      auVar13 = vfmadd213ps_fma(auVar97,auVar97,ZEXT832(0) << 0x20);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar139,auVar139);
      auVar116 = vrsqrtps_avx(ZEXT1632(auVar13));
      fVar125 = auVar116._0_4_;
      fVar101 = auVar116._4_4_;
      fVar102 = auVar116._8_4_;
      fVar103 = auVar116._12_4_;
      fVar104 = auVar116._16_4_;
      fVar105 = auVar116._20_4_;
      fVar106 = auVar116._24_4_;
      auVar18._4_4_ = fVar101 * fVar101 * fVar101 * auVar13._4_4_ * -0.5;
      auVar18._0_4_ = fVar125 * fVar125 * fVar125 * auVar13._0_4_ * -0.5;
      auVar18._8_4_ = fVar102 * fVar102 * fVar102 * auVar13._8_4_ * -0.5;
      auVar18._12_4_ = fVar103 * fVar103 * fVar103 * auVar13._12_4_ * -0.5;
      auVar18._16_4_ = fVar104 * fVar104 * fVar104 * -0.0;
      auVar18._20_4_ = fVar105 * fVar105 * fVar105 * -0.0;
      auVar18._24_4_ = fVar106 * fVar106 * fVar106 * -0.0;
      auVar18._28_4_ = 0;
      auVar221._8_4_ = 0x3fc00000;
      auVar221._0_8_ = 0x3fc000003fc00000;
      auVar221._12_4_ = 0x3fc00000;
      auVar221._16_4_ = 0x3fc00000;
      auVar221._20_4_ = 0x3fc00000;
      auVar221._24_4_ = 0x3fc00000;
      auVar221._28_4_ = 0x3fc00000;
      auVar13 = vfmadd231ps_fma(auVar18,auVar221,auVar116);
      fVar125 = auVar13._0_4_;
      fVar101 = auVar13._4_4_;
      auVar173._4_4_ = fVar101 * auVar139._4_4_;
      auVar173._0_4_ = fVar125 * auVar139._0_4_;
      fVar102 = auVar13._8_4_;
      auVar173._8_4_ = fVar102 * auVar139._8_4_;
      fVar103 = auVar13._12_4_;
      auVar173._12_4_ = fVar103 * auVar139._12_4_;
      auVar173._16_4_ = auVar139._16_4_ * 0.0;
      auVar173._20_4_ = auVar139._20_4_ * 0.0;
      auVar173._24_4_ = auVar139._24_4_ * 0.0;
      auVar173._28_4_ = 0;
      auVar26._4_4_ = fVar101 * -auVar97._4_4_;
      auVar26._0_4_ = fVar125 * -auVar97._0_4_;
      auVar26._8_4_ = fVar102 * -auVar97._8_4_;
      auVar26._12_4_ = fVar103 * -auVar97._12_4_;
      auVar26._16_4_ = -auVar97._16_4_ * 0.0;
      auVar26._20_4_ = -auVar97._20_4_ * 0.0;
      auVar26._24_4_ = -auVar97._24_4_ * 0.0;
      auVar26._28_4_ = auVar116._28_4_;
      auVar13 = vfmadd213ps_fma(auVar165,auVar165,ZEXT832(0) << 0x20);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar95,auVar95);
      auVar116 = vrsqrtps_avx(ZEXT1632(auVar13));
      auVar27._28_4_ = uVar207;
      auVar27._0_28_ =
           ZEXT1628(CONCAT412(fVar103 * 0.0,
                              CONCAT48(fVar102 * 0.0,CONCAT44(fVar101 * 0.0,fVar125 * 0.0))));
      fVar125 = auVar116._0_4_;
      fVar101 = auVar116._4_4_;
      fVar102 = auVar116._8_4_;
      fVar103 = auVar116._12_4_;
      fVar104 = auVar116._16_4_;
      fVar105 = auVar116._20_4_;
      fVar106 = auVar116._24_4_;
      auVar214._0_4_ = fVar125 * fVar125 * fVar125 * auVar13._0_4_ * -0.5;
      auVar214._4_4_ = fVar101 * fVar101 * fVar101 * auVar13._4_4_ * -0.5;
      auVar214._8_4_ = fVar102 * fVar102 * fVar102 * auVar13._8_4_ * -0.5;
      auVar214._12_4_ = fVar103 * fVar103 * fVar103 * auVar13._12_4_ * -0.5;
      auVar214._16_4_ = fVar104 * fVar104 * fVar104 * -0.0;
      auVar214._20_4_ = fVar105 * fVar105 * fVar105 * -0.0;
      auVar214._24_4_ = fVar106 * fVar106 * fVar106 * -0.0;
      auVar214._28_4_ = 0;
      auVar13 = vfmadd231ps_fma(auVar214,auVar221,auVar116);
      fVar125 = auVar13._0_4_;
      auVar208._0_4_ = auVar95._0_4_ * fVar125;
      fVar101 = auVar13._4_4_;
      auVar208._4_4_ = auVar95._4_4_ * fVar101;
      fVar102 = auVar13._8_4_;
      auVar208._8_4_ = auVar95._8_4_ * fVar102;
      fVar103 = auVar13._12_4_;
      auVar208._12_4_ = auVar95._12_4_ * fVar103;
      auVar208._16_4_ = auVar95._16_4_ * 0.0;
      auVar208._20_4_ = auVar95._20_4_ * 0.0;
      auVar208._24_4_ = auVar95._24_4_ * 0.0;
      auVar208._28_4_ = 0;
      auVar116._4_4_ = fVar101 * -auVar165._4_4_;
      auVar116._0_4_ = fVar125 * -auVar165._0_4_;
      auVar116._8_4_ = fVar102 * -auVar165._8_4_;
      auVar116._12_4_ = fVar103 * -auVar165._12_4_;
      auVar116._16_4_ = -auVar165._16_4_ * 0.0;
      auVar116._20_4_ = -auVar165._20_4_ * 0.0;
      auVar116._24_4_ = -auVar165._24_4_ * 0.0;
      auVar116._28_4_ = auVar97._28_4_ ^ 0x80000000;
      auVar28._28_4_ = 0xbf000000;
      auVar28._0_28_ =
           ZEXT1628(CONCAT412(fVar103 * 0.0,
                              CONCAT48(fVar102 * 0.0,CONCAT44(fVar101 * 0.0,fVar125 * 0.0))));
      auVar13 = vfmadd213ps_fma(auVar173,ZEXT1632(auVar14),auVar109);
      auVar165 = ZEXT1632(auVar14);
      auVar16 = vfmadd213ps_fma(auVar26,auVar165,_local_440);
      auVar17 = vfmadd213ps_fma(auVar27,auVar165,ZEXT1632(auVar151));
      auVar127 = vfnmadd213ps_fma(auVar173,auVar165,auVar109);
      auVar89 = vfmadd213ps_fma(auVar208,ZEXT1632(auVar15),auVar91);
      auVar142 = vfnmadd213ps_fma(auVar26,auVar165,_local_440);
      auVar165 = ZEXT1632(auVar15);
      auVar88 = vfmadd213ps_fma(auVar116,auVar165,local_2c0);
      local_720 = ZEXT1632(auVar14);
      auVar107 = vfnmadd231ps_fma(ZEXT1632(auVar151),local_720,auVar27);
      auVar14 = vfmadd213ps_fma(auVar28,auVar165,_local_300);
      auVar148 = vfnmadd213ps_fma(auVar208,auVar165,auVar91);
      auVar86 = vfnmadd213ps_fma(auVar116,auVar165,local_2c0);
      local_420 = ZEXT1632(auVar15);
      auVar147 = vfnmadd231ps_fma(_local_300,local_420,auVar28);
      auVar165 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar142));
      auVar95 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar107));
      auVar91._4_4_ = auVar107._4_4_ * auVar165._4_4_;
      auVar91._0_4_ = auVar107._0_4_ * auVar165._0_4_;
      auVar91._8_4_ = auVar107._8_4_ * auVar165._8_4_;
      auVar91._12_4_ = auVar107._12_4_ * auVar165._12_4_;
      auVar91._16_4_ = auVar165._16_4_ * 0.0;
      auVar91._20_4_ = auVar165._20_4_ * 0.0;
      auVar91._24_4_ = auVar165._24_4_ * 0.0;
      auVar91._28_4_ = 0;
      auVar15 = vfmsub231ps_fma(auVar91,ZEXT1632(auVar142),auVar95);
      auVar109._4_4_ = auVar95._4_4_ * auVar127._4_4_;
      auVar109._0_4_ = auVar95._0_4_ * auVar127._0_4_;
      auVar109._8_4_ = auVar95._8_4_ * auVar127._8_4_;
      auVar109._12_4_ = auVar95._12_4_ * auVar127._12_4_;
      auVar109._16_4_ = auVar95._16_4_ * 0.0;
      auVar109._20_4_ = auVar95._20_4_ * 0.0;
      auVar109._24_4_ = auVar95._24_4_ * 0.0;
      auVar109._28_4_ = auVar95._28_4_;
      auVar95 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar127));
      auVar151 = vfmsub231ps_fma(auVar109,ZEXT1632(auVar107),auVar95);
      auVar29._4_4_ = auVar142._4_4_ * auVar95._4_4_;
      auVar29._0_4_ = auVar142._0_4_ * auVar95._0_4_;
      auVar29._8_4_ = auVar142._8_4_ * auVar95._8_4_;
      auVar29._12_4_ = auVar142._12_4_ * auVar95._12_4_;
      auVar29._16_4_ = auVar95._16_4_ * 0.0;
      auVar29._20_4_ = auVar95._20_4_ * 0.0;
      auVar29._24_4_ = auVar95._24_4_ * 0.0;
      auVar29._28_4_ = auVar95._28_4_;
      auVar138 = ZEXT1632(auVar127);
      auVar127 = vfmsub231ps_fma(auVar29,auVar138,auVar165);
      auVar165 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar151 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar165,ZEXT1632(auVar151));
      auVar151 = vfmadd231ps_fma(ZEXT1632(auVar151),auVar165,ZEXT1632(auVar15));
      auVar18 = vcmpps_avx(ZEXT1632(auVar151),ZEXT1232(ZEXT412(0)) << 0x20,2);
      auVar165 = vblendvps_avx(ZEXT1632(auVar148),ZEXT1632(auVar13),auVar18);
      local_400 = vblendvps_avx(ZEXT1632(auVar86),ZEXT1632(auVar16),auVar18);
      auVar95 = vblendvps_avx(ZEXT1632(auVar147),ZEXT1632(auVar17),auVar18);
      auVar97 = vblendvps_avx(auVar138,ZEXT1632(auVar89),auVar18);
      auVar116 = vblendvps_avx(ZEXT1632(auVar142),ZEXT1632(auVar88),auVar18);
      auVar139 = vblendvps_avx(ZEXT1632(auVar107),ZEXT1632(auVar14),auVar18);
      auVar138 = vblendvps_avx(ZEXT1632(auVar89),auVar138,auVar18);
      auVar96 = vblendvps_avx(ZEXT1632(auVar88),ZEXT1632(auVar142),auVar18);
      auVar151 = vpackssdw_avx(local_2e0._0_16_,local_2e0._16_16_);
      local_760 = ZEXT1632(auVar151);
      auVar12 = vblendvps_avx(ZEXT1632(auVar14),ZEXT1632(auVar107),auVar18);
      auVar173 = vsubps_avx(auVar138,auVar165);
      auVar96 = vsubps_avx(auVar96,local_400);
      auVar92 = vsubps_avx(auVar12,auVar95);
      auVar204 = vsubps_avx(auVar165,auVar97);
      auVar19 = vsubps_avx(local_400,auVar116);
      auVar20 = vsubps_avx(auVar95,auVar139);
      auVar30._4_4_ = auVar92._4_4_ * auVar165._4_4_;
      auVar30._0_4_ = auVar92._0_4_ * auVar165._0_4_;
      auVar30._8_4_ = auVar92._8_4_ * auVar165._8_4_;
      auVar30._12_4_ = auVar92._12_4_ * auVar165._12_4_;
      auVar30._16_4_ = auVar92._16_4_ * auVar165._16_4_;
      auVar30._20_4_ = auVar92._20_4_ * auVar165._20_4_;
      auVar30._24_4_ = auVar92._24_4_ * auVar165._24_4_;
      auVar30._28_4_ = auVar12._28_4_;
      auVar13 = vfmsub231ps_fma(auVar30,auVar95,auVar173);
      auVar31._4_4_ = auVar173._4_4_ * local_400._4_4_;
      auVar31._0_4_ = auVar173._0_4_ * local_400._0_4_;
      auVar31._8_4_ = auVar173._8_4_ * local_400._8_4_;
      auVar31._12_4_ = auVar173._12_4_ * local_400._12_4_;
      auVar31._16_4_ = auVar173._16_4_ * local_400._16_4_;
      auVar31._20_4_ = auVar173._20_4_ * local_400._20_4_;
      auVar31._24_4_ = auVar173._24_4_ * local_400._24_4_;
      auVar31._28_4_ = auVar138._28_4_;
      local_660 = auVar165;
      auVar14 = vfmsub231ps_fma(auVar31,auVar165,auVar96);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
      auVar93._0_4_ = auVar96._0_4_ * auVar95._0_4_;
      auVar93._4_4_ = auVar96._4_4_ * auVar95._4_4_;
      auVar93._8_4_ = auVar96._8_4_ * auVar95._8_4_;
      auVar93._12_4_ = auVar96._12_4_ * auVar95._12_4_;
      auVar93._16_4_ = auVar96._16_4_ * auVar95._16_4_;
      auVar93._20_4_ = auVar96._20_4_ * auVar95._20_4_;
      auVar93._24_4_ = auVar96._24_4_ * auVar95._24_4_;
      auVar93._28_4_ = 0;
      auVar14 = vfmsub231ps_fma(auVar93,local_400,auVar92);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
      auVar94._0_4_ = auVar20._0_4_ * auVar97._0_4_;
      auVar94._4_4_ = auVar20._4_4_ * auVar97._4_4_;
      auVar94._8_4_ = auVar20._8_4_ * auVar97._8_4_;
      auVar94._12_4_ = auVar20._12_4_ * auVar97._12_4_;
      auVar94._16_4_ = auVar20._16_4_ * auVar97._16_4_;
      auVar94._20_4_ = auVar20._20_4_ * auVar97._20_4_;
      auVar94._24_4_ = auVar20._24_4_ * auVar97._24_4_;
      auVar94._28_4_ = 0;
      auVar13 = vfmsub231ps_fma(auVar94,auVar204,auVar139);
      auVar113._0_4_ = auVar19._0_4_ * auVar139._0_4_;
      auVar113._4_4_ = auVar19._4_4_ * auVar139._4_4_;
      auVar113._8_4_ = auVar19._8_4_ * auVar139._8_4_;
      auVar113._12_4_ = auVar19._12_4_ * auVar139._12_4_;
      auVar113._16_4_ = auVar19._16_4_ * auVar139._16_4_;
      auVar113._20_4_ = auVar19._20_4_ * auVar139._20_4_;
      auVar113._24_4_ = auVar19._24_4_ * auVar139._24_4_;
      auVar113._28_4_ = 0;
      auVar15 = vfmsub231ps_fma(auVar113,auVar116,auVar20);
      auVar32._4_4_ = auVar204._4_4_ * auVar116._4_4_;
      auVar32._0_4_ = auVar204._0_4_ * auVar116._0_4_;
      auVar32._8_4_ = auVar204._8_4_ * auVar116._8_4_;
      auVar32._12_4_ = auVar204._12_4_ * auVar116._12_4_;
      auVar32._16_4_ = auVar204._16_4_ * auVar116._16_4_;
      auVar32._20_4_ = auVar204._20_4_ * auVar116._20_4_;
      auVar32._24_4_ = auVar204._24_4_ * auVar116._24_4_;
      auVar32._28_4_ = auVar116._28_4_;
      auVar16 = vfmsub231ps_fma(auVar32,auVar19,auVar97);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
      auVar116 = vmaxps_avx(ZEXT1632(auVar14),ZEXT1632(auVar15));
      auVar116 = vcmpps_avx(auVar116,ZEXT832(0) << 0x20,2);
      auVar13 = vpackssdw_avx(auVar116._0_16_,auVar116._16_16_);
      auVar151 = vpand_avx(auVar13,auVar151);
      auVar116 = vpmovsxwd_avx2(auVar151);
      if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar116 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar116 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar116 >> 0x7f,0) == '\0') &&
            (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar116 >> 0xbf,0) == '\0') &&
          (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar116[0x1f]) {
LAB_01121b53:
        auVar159._8_8_ = local_4c0[1]._8_8_;
        auVar159._0_8_ = local_4c0[1]._0_8_;
        auVar159._16_8_ = local_4c0[1]._16_8_;
        auVar159._24_8_ = local_4c0[1]._24_8_;
      }
      else {
        local_760 = ZEXT1632(auVar151);
        auVar114._0_4_ = auVar96._0_4_ * auVar20._0_4_;
        auVar114._4_4_ = auVar96._4_4_ * auVar20._4_4_;
        auVar114._8_4_ = auVar96._8_4_ * auVar20._8_4_;
        auVar114._12_4_ = auVar96._12_4_ * auVar20._12_4_;
        auVar114._16_4_ = auVar96._16_4_ * auVar20._16_4_;
        auVar114._20_4_ = auVar96._20_4_ * auVar20._20_4_;
        auVar114._24_4_ = auVar96._24_4_ * auVar20._24_4_;
        auVar114._28_4_ = 0;
        auVar89 = vfmsub231ps_fma(auVar114,auVar19,auVar92);
        auVar33._4_4_ = auVar92._4_4_ * auVar204._4_4_;
        auVar33._0_4_ = auVar92._0_4_ * auVar204._0_4_;
        auVar33._8_4_ = auVar92._8_4_ * auVar204._8_4_;
        auVar33._12_4_ = auVar92._12_4_ * auVar204._12_4_;
        auVar33._16_4_ = auVar92._16_4_ * auVar204._16_4_;
        auVar33._20_4_ = auVar92._20_4_ * auVar204._20_4_;
        auVar33._24_4_ = auVar92._24_4_ * auVar204._24_4_;
        auVar33._28_4_ = auVar97._28_4_;
        auVar17 = vfmsub231ps_fma(auVar33,auVar173,auVar20);
        auVar34._4_4_ = auVar173._4_4_ * auVar19._4_4_;
        auVar34._0_4_ = auVar173._0_4_ * auVar19._0_4_;
        auVar34._8_4_ = auVar173._8_4_ * auVar19._8_4_;
        auVar34._12_4_ = auVar173._12_4_ * auVar19._12_4_;
        auVar34._16_4_ = auVar173._16_4_ * auVar19._16_4_;
        auVar34._20_4_ = auVar173._20_4_ * auVar19._20_4_;
        auVar34._24_4_ = auVar173._24_4_ * auVar19._24_4_;
        auVar34._28_4_ = auVar173._28_4_;
        auVar88 = vfmsub231ps_fma(auVar34,auVar204,auVar96);
        auVar13 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar17),ZEXT1632(auVar88));
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT1632(auVar89),ZEXT832(0) << 0x20);
        auVar97 = vrcpps_avx(ZEXT1632(auVar16));
        auVar209._8_4_ = 0x3f800000;
        auVar209._0_8_ = 0x3f8000003f800000;
        auVar209._12_4_ = 0x3f800000;
        auVar209._16_4_ = 0x3f800000;
        auVar209._20_4_ = 0x3f800000;
        auVar209._24_4_ = 0x3f800000;
        auVar209._28_4_ = 0x3f800000;
        auVar13 = vfnmadd213ps_fma(auVar97,ZEXT1632(auVar16),auVar209);
        auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar97,auVar97);
        auVar35._4_4_ = auVar88._4_4_ * auVar95._4_4_;
        auVar35._0_4_ = auVar88._0_4_ * auVar95._0_4_;
        auVar35._8_4_ = auVar88._8_4_ * auVar95._8_4_;
        auVar35._12_4_ = auVar88._12_4_ * auVar95._12_4_;
        auVar35._16_4_ = auVar95._16_4_ * 0.0;
        auVar35._20_4_ = auVar95._20_4_ * 0.0;
        auVar35._24_4_ = auVar95._24_4_ * 0.0;
        auVar35._28_4_ = auVar95._28_4_;
        auVar17 = vfmadd231ps_fma(auVar35,ZEXT1632(auVar17),local_400);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT1632(auVar89),auVar165);
        fVar101 = auVar13._0_4_;
        fVar102 = auVar13._4_4_;
        fVar103 = auVar13._8_4_;
        fVar104 = auVar13._12_4_;
        auVar36._28_4_ = auVar139._28_4_;
        auVar36._0_28_ =
             ZEXT1628(CONCAT412(fVar104 * auVar17._12_4_,
                                CONCAT48(fVar103 * auVar17._8_4_,
                                         CONCAT44(fVar102 * auVar17._4_4_,fVar101 * auVar17._0_4_)))
                     );
        auVar115._8_8_ = local_640._0_8_;
        auVar115._0_8_ = local_640._0_8_;
        auVar115._16_8_ = local_640._0_8_;
        auVar115._24_8_ = local_640._0_8_;
        fVar125 = (ray->super_RayK<1>).tfar;
        auVar158._4_4_ = fVar125;
        auVar158._0_4_ = fVar125;
        auVar158._8_4_ = fVar125;
        auVar158._12_4_ = fVar125;
        auVar158._16_4_ = fVar125;
        auVar158._20_4_ = fVar125;
        auVar158._24_4_ = fVar125;
        auVar158._28_4_ = fVar125;
        auVar95 = vcmpps_avx(auVar115,auVar36,2);
        auVar97 = vcmpps_avx(auVar36,auVar158,2);
        auVar95 = vandps_avx(auVar97,auVar95);
        auVar13 = vpackssdw_avx(auVar95._0_16_,auVar95._16_16_);
        auVar151 = vpand_avx(auVar13,auVar151);
        auVar95 = vpmovsxwd_avx2(auVar151);
        if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar95 >> 0x7f,0) == '\0') &&
              (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar95 >> 0xbf,0) == '\0') &&
            (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar95[0x1f]) goto LAB_01121b53;
        auVar95 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar16),4);
        auVar13 = vpackssdw_avx(auVar95._0_16_,auVar95._16_16_);
        auVar151 = vpand_avx(auVar151,auVar13);
        auVar95 = vpmovsxwd_avx2(auVar151);
        auVar159._8_8_ = local_4c0[1]._8_8_;
        auVar159._0_8_ = local_4c0[1]._0_8_;
        auVar159._16_8_ = local_4c0[1]._16_8_;
        auVar159._24_8_ = local_4c0[1]._24_8_;
        if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar95 >> 0x7f,0) != '\0') ||
              (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar95 >> 0xbf,0) != '\0') ||
            (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar95[0x1f] < '\0') {
          auVar116 = ZEXT1632(CONCAT412(fVar104 * auVar14._12_4_,
                                        CONCAT48(fVar103 * auVar14._8_4_,
                                                 CONCAT44(fVar102 * auVar14._4_4_,
                                                          fVar101 * auVar14._0_4_))));
          auVar139 = ZEXT1632(CONCAT412(fVar104 * auVar15._12_4_,
                                        CONCAT48(fVar103 * auVar15._8_4_,
                                                 CONCAT44(fVar102 * auVar15._4_4_,
                                                          fVar101 * auVar15._0_4_))));
          auVar172._8_4_ = 0x3f800000;
          auVar172._0_8_ = 0x3f8000003f800000;
          auVar172._12_4_ = 0x3f800000;
          auVar172._16_4_ = 0x3f800000;
          auVar172._20_4_ = 0x3f800000;
          auVar172._24_4_ = 0x3f800000;
          auVar172._28_4_ = 0x3f800000;
          auVar97 = vsubps_avx(auVar172,auVar116);
          _local_120 = vblendvps_avx(auVar97,auVar116,auVar18);
          auVar97 = vsubps_avx(auVar172,auVar139);
          local_340 = vblendvps_avx(auVar97,auVar139,auVar18);
          local_320 = auVar36;
          auVar159 = auVar95;
        }
      }
      auVar223 = ZEXT3264(local_680);
      auVar217 = ZEXT3264(_local_540);
      auVar210 = ZEXT3264(local_5a0);
      auVar205 = ZEXT3264(local_600);
      auVar189 = ZEXT3264(local_560);
      auVar124 = ZEXT3264(auVar144);
      _local_6f0 = auVar108;
      local_6e0 = auVar87;
      local_6d0 = auVar128;
      if ((((((((auVar159 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar159 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar159 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar159 >> 0x7f,0) != '\0') ||
            (auVar159 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar159 >> 0xbf,0) != '\0') ||
          (auVar159 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar159[0x1f] < '\0') {
        auVar95 = vsubps_avx(local_420,local_720);
        auVar151 = vfmadd213ps_fma(auVar95,_local_120,local_720);
        fVar125 = pre->depth_scale;
        auVar37._4_4_ = (auVar151._4_4_ + auVar151._4_4_) * fVar125;
        auVar37._0_4_ = (auVar151._0_4_ + auVar151._0_4_) * fVar125;
        auVar37._8_4_ = (auVar151._8_4_ + auVar151._8_4_) * fVar125;
        auVar37._12_4_ = (auVar151._12_4_ + auVar151._12_4_) * fVar125;
        auVar37._16_4_ = fVar125 * 0.0;
        auVar37._20_4_ = fVar125 * 0.0;
        auVar37._24_4_ = fVar125 * 0.0;
        auVar37._28_4_ = 0;
        auVar95 = vcmpps_avx(local_320,auVar37,6);
        auVar97 = auVar159 & auVar95;
        if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar97 >> 0x7f,0) != '\0') ||
              (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar97 >> 0xbf,0) != '\0') ||
            (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar97[0x1f] < '\0') {
          auVar117._8_4_ = 0xbf800000;
          auVar117._0_8_ = 0xbf800000bf800000;
          auVar117._12_4_ = 0xbf800000;
          auVar117._16_4_ = 0xbf800000;
          auVar117._20_4_ = 0xbf800000;
          auVar117._24_4_ = 0xbf800000;
          auVar117._28_4_ = 0xbf800000;
          auVar140._8_4_ = 0x40000000;
          auVar140._0_8_ = 0x4000000040000000;
          auVar140._12_4_ = 0x40000000;
          auVar140._16_4_ = 0x40000000;
          auVar140._20_4_ = 0x40000000;
          auVar140._24_4_ = 0x40000000;
          auVar140._28_4_ = 0x40000000;
          auVar151 = vfmadd213ps_fma(local_340,auVar140,auVar117);
          local_260 = _local_120;
          local_340 = ZEXT1632(auVar151);
          auVar97 = local_340;
          local_240 = ZEXT1632(auVar151);
          local_220 = local_320;
          local_200 = 0;
          local_1fc = iVar9;
          local_1f0 = *(undefined8 *)pPVar1;
          uStack_1e8 = *(undefined8 *)(pPVar1 + 8);
          local_1e0 = local_6d0._0_8_;
          uStack_1d8 = local_6d0._8_8_;
          local_1d0 = local_6e0._0_8_;
          uStack_1c8 = local_6e0._8_8_;
          local_1c0 = local_6f0;
          uStack_1b8 = uStack_6e8;
          local_340 = auVar97;
          if ((local_480->mask & (ray->super_RayK<1>).mask) != 0) {
            auVar95 = vandps_avx(auVar95,auVar159);
            local_4c0[0] = auVar95;
            fVar125 = 1.0 / auVar111._0_4_;
            local_180[0] = fVar125 * ((float)local_120._0_4_ + 0.0);
            local_180[1] = fVar125 * ((float)local_120._4_4_ + 1.0);
            local_180[2] = fVar125 * (fStack_118 + 2.0);
            local_180[3] = fVar125 * (fStack_114 + 3.0);
            fStack_170 = fVar125 * (fStack_110 + 4.0);
            fStack_16c = fVar125 * (fStack_10c + 5.0);
            fStack_168 = fVar125 * (fStack_108 + 6.0);
            fStack_164 = fStack_104 + 7.0;
            local_340._0_8_ = auVar151._0_8_;
            local_340._8_8_ = auVar151._8_8_;
            local_160 = local_340._0_8_;
            uStack_158 = local_340._8_8_;
            uStack_150 = 0;
            uStack_148 = 0;
            local_140 = local_320;
            auVar118._8_4_ = 0x7f800000;
            auVar118._0_8_ = 0x7f8000007f800000;
            auVar118._12_4_ = 0x7f800000;
            auVar118._16_4_ = 0x7f800000;
            auVar118._20_4_ = 0x7f800000;
            auVar118._24_4_ = 0x7f800000;
            auVar118._28_4_ = 0x7f800000;
            auVar97 = vblendvps_avx(auVar118,local_320,auVar95);
            auVar116 = vshufps_avx(auVar97,auVar97,0xb1);
            auVar116 = vminps_avx(auVar97,auVar116);
            auVar139 = vshufpd_avx(auVar116,auVar116,5);
            auVar116 = vminps_avx(auVar116,auVar139);
            auVar139 = vpermpd_avx2(auVar116,0x4e);
            auVar116 = vminps_avx(auVar116,auVar139);
            auVar97 = vcmpps_avx(auVar97,auVar116,0);
            auVar116 = auVar95 & auVar97;
            if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar116 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar116 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar116 >> 0x7f,0) != '\0') ||
                  (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar116 >> 0xbf,0) != '\0') ||
                (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar116[0x1f] < '\0') {
              auVar95 = vandps_avx(auVar97,auVar95);
            }
            uVar74 = vmovmskps_avx(auVar95);
            uVar76 = 0;
            for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
              uVar76 = uVar76 + 1;
            }
            uVar77 = (ulong)uVar76;
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (local_480->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              local_660._4_28_ = auVar165._4_28_;
              local_760 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
              local_764 = uVar75;
              local_770 = uVar79;
              do {
                local_5d4 = local_180[uVar77];
                local_5d0 = *(undefined4 *)((long)&local_160 + uVar77 * 4);
                (ray->super_RayK<1>).tfar = *(float *)(local_140 + uVar77 * 4);
                local_6b0.context = context->user;
                fVar125 = 1.0 - local_5d4;
                auVar151 = ZEXT416((uint)(local_5d4 * fVar125 * 4.0));
                auVar13 = vfnmsub213ss_fma(ZEXT416((uint)local_5d4),ZEXT416((uint)local_5d4),
                                           auVar151);
                auVar151 = vfmadd213ss_fma(ZEXT416((uint)fVar125),ZEXT416((uint)fVar125),auVar151);
                fVar125 = fVar125 * -fVar125 * 0.5;
                fVar101 = auVar13._0_4_ * 0.5;
                fVar102 = auVar151._0_4_ * 0.5;
                fVar103 = local_5d4 * local_5d4 * 0.5;
                auVar156._0_4_ = fVar103 * (float)local_6f0._0_4_;
                auVar156._4_4_ = fVar103 * (float)local_6f0._4_4_;
                auVar156._8_4_ = fVar103 * (float)uStack_6e8;
                auVar156._12_4_ = fVar103 * uStack_6e8._4_4_;
                auVar135._4_4_ = fVar102;
                auVar135._0_4_ = fVar102;
                auVar135._8_4_ = fVar102;
                auVar135._12_4_ = fVar102;
                auVar151 = vfmadd132ps_fma(auVar135,auVar156,local_6e0);
                auVar157._4_4_ = fVar101;
                auVar157._0_4_ = fVar101;
                auVar157._8_4_ = fVar101;
                auVar157._12_4_ = fVar101;
                auVar151 = vfmadd132ps_fma(auVar157,auVar151,local_6d0);
                auVar136._4_4_ = fVar125;
                auVar136._0_4_ = fVar125;
                auVar136._8_4_ = fVar125;
                auVar136._12_4_ = fVar125;
                auVar71._8_8_ = uStack_6f8;
                auVar71._0_8_ = local_700;
                auVar151 = vfmadd132ps_fma(auVar136,auVar151,auVar71);
                local_5e0 = vmovlps_avx(auVar151);
                local_5d8 = vextractps_avx(auVar151,2);
                local_5cc = uVar75;
                local_5c8 = (int)uVar79;
                local_5c4 = (local_6b0.context)->instID[0];
                local_5c0 = (local_6b0.context)->instPrimID[0];
                local_774 = -1;
                local_6b0.valid = &local_774;
                local_6b0.geometryUserPtr = local_480->userPtr;
                local_6b0.ray = (RTCRayN *)ray;
                local_6b0.hit = (RTCHitN *)&local_5e0;
                local_6b0.N = 1;
                local_720._0_8_ = uVar77;
                if (local_480->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01121db8:
                  p_Var11 = context->args->filter;
                  if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((local_480->field_8).field_0x2 & 0x40) != 0)))) {
                    (*p_Var11)(&local_6b0);
                    auVar217 = ZEXT3264(_local_540);
                    auVar210 = ZEXT3264(local_5a0);
                    auVar124 = ZEXT3264(local_620);
                    auVar223 = ZEXT3264(local_680);
                    auVar189 = ZEXT3264(local_560);
                    auVar205 = ZEXT3264(local_600);
                    uVar77 = local_720._0_8_;
                    pre = local_6b8;
                    uVar79 = local_770;
                    uVar75 = local_764;
                    fVar126 = (float)local_740._0_4_;
                    if (*local_6b0.valid == 0) goto LAB_01121ed0;
                  }
                  (((Vec3f *)((long)local_6b0.ray + 0x30))->field_0).components[0] =
                       *(float *)local_6b0.hit;
                  (((Vec3f *)((long)local_6b0.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_6b0.hit + 4);
                  (((Vec3f *)((long)local_6b0.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_6b0.hit + 8);
                  *(float *)((long)local_6b0.ray + 0x3c) = *(float *)(local_6b0.hit + 0xc);
                  *(float *)((long)local_6b0.ray + 0x40) = *(float *)(local_6b0.hit + 0x10);
                  *(float *)((long)local_6b0.ray + 0x44) = *(float *)(local_6b0.hit + 0x14);
                  *(float *)((long)local_6b0.ray + 0x48) = *(float *)(local_6b0.hit + 0x18);
                  *(float *)((long)local_6b0.ray + 0x4c) = *(float *)(local_6b0.hit + 0x1c);
                  *(float *)((long)local_6b0.ray + 0x50) = *(float *)(local_6b0.hit + 0x20);
                }
                else {
                  (*local_480->intersectionFilterN)(&local_6b0);
                  auVar217 = ZEXT3264(_local_540);
                  auVar210 = ZEXT3264(local_5a0);
                  auVar124 = ZEXT3264(local_620);
                  auVar223 = ZEXT3264(local_680);
                  auVar189 = ZEXT3264(local_560);
                  auVar205 = ZEXT3264(local_600);
                  uVar77 = local_720._0_8_;
                  pre = local_6b8;
                  uVar79 = local_770;
                  uVar75 = local_764;
                  fVar126 = (float)local_740._0_4_;
                  if (*local_6b0.valid != 0) goto LAB_01121db8;
LAB_01121ed0:
                  (ray->super_RayK<1>).tfar = (float)local_760._0_4_;
                  uVar77 = local_720._0_8_;
                  pre = local_6b8;
                  uVar79 = local_770;
                  uVar75 = local_764;
                }
                auVar144 = auVar124._0_32_;
                *(undefined4 *)(local_4c0[0] + uVar77 * 4) = 0;
                auVar97 = local_4c0[0];
                fVar125 = (ray->super_RayK<1>).tfar;
                auVar100._4_4_ = fVar125;
                auVar100._0_4_ = fVar125;
                auVar100._8_4_ = fVar125;
                auVar100._12_4_ = fVar125;
                auVar100._16_4_ = fVar125;
                auVar100._20_4_ = fVar125;
                auVar100._24_4_ = fVar125;
                auVar100._28_4_ = fVar125;
                auVar95 = vcmpps_avx(local_320,auVar100,2);
                auVar165 = vandps_avx(auVar95,local_4c0[0]);
                local_4c0[0] = auVar165;
                auVar97 = auVar97 & auVar95;
                if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar97 >> 0x7f,0) == '\0') &&
                      (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar97 >> 0xbf,0) == '\0') &&
                    (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar97[0x1f]) goto LAB_01120c2d;
                auVar123._8_4_ = 0x7f800000;
                auVar123._0_8_ = 0x7f8000007f800000;
                auVar123._12_4_ = 0x7f800000;
                auVar123._16_4_ = 0x7f800000;
                auVar123._20_4_ = 0x7f800000;
                auVar123._24_4_ = 0x7f800000;
                auVar123._28_4_ = 0x7f800000;
                auVar95 = vblendvps_avx(auVar123,local_320,auVar165);
                auVar97 = vshufps_avx(auVar95,auVar95,0xb1);
                auVar97 = vminps_avx(auVar95,auVar97);
                auVar116 = vshufpd_avx(auVar97,auVar97,5);
                auVar97 = vminps_avx(auVar97,auVar116);
                auVar116 = vpermpd_avx2(auVar97,0x4e);
                auVar97 = vminps_avx(auVar97,auVar116);
                auVar95 = vcmpps_avx(auVar95,auVar97,0);
                auVar97 = auVar165 & auVar95;
                if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar97 >> 0x7f,0) != '\0') ||
                      (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar97 >> 0xbf,0) != '\0') ||
                    (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar97[0x1f] < '\0') {
                  auVar165 = vandps_avx(auVar95,auVar165);
                }
                local_760 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                uVar76 = vmovmskps_avx(auVar165);
                uVar8 = 0;
                for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000) {
                  uVar8 = uVar8 + 1;
                }
                uVar77 = (ulong)uVar8;
              } while( true );
            }
            fVar125 = local_180[uVar77];
            fVar101 = *(float *)((long)&local_160 + uVar77 * 4);
            fVar102 = 1.0 - fVar125;
            auVar151 = ZEXT416((uint)(fVar125 * fVar102 * 4.0));
            auVar13 = vfnmsub213ss_fma(ZEXT416((uint)fVar125),ZEXT416((uint)fVar125),auVar151);
            auVar151 = vfmadd213ss_fma(ZEXT416((uint)fVar102),ZEXT416((uint)fVar102),auVar151);
            fVar102 = fVar102 * -fVar102 * 0.5;
            fVar103 = auVar13._0_4_ * 0.5;
            fVar104 = auVar151._0_4_ * 0.5;
            fVar105 = fVar125 * fVar125 * 0.5;
            auVar149._0_4_ = fVar105 * (float)local_6f0._0_4_;
            auVar149._4_4_ = fVar105 * (float)local_6f0._4_4_;
            auVar149._8_4_ = fVar105 * (float)uStack_6e8;
            auVar149._12_4_ = fVar105 * uStack_6e8._4_4_;
            auVar129._4_4_ = fVar104;
            auVar129._0_4_ = fVar104;
            auVar129._8_4_ = fVar104;
            auVar129._12_4_ = fVar104;
            auVar151 = vfmadd132ps_fma(auVar129,auVar149,local_6e0);
            auVar150._4_4_ = fVar103;
            auVar150._0_4_ = fVar103;
            auVar150._8_4_ = fVar103;
            auVar150._12_4_ = fVar103;
            auVar151 = vfmadd132ps_fma(auVar150,auVar151,local_6d0);
            auVar130._4_4_ = fVar102;
            auVar130._0_4_ = fVar102;
            auVar130._8_4_ = fVar102;
            auVar130._12_4_ = fVar102;
            auVar151 = vfmadd132ps_fma(auVar130,auVar151,*(undefined1 (*) [16])pPVar1);
            (ray->super_RayK<1>).tfar = *(float *)(local_140 + uVar77 * 4);
            uVar85 = vmovlps_avx(auVar151);
            *(undefined8 *)&(ray->Ng).field_0 = uVar85;
            fVar102 = (float)vextractps_avx(auVar151,2);
            (ray->Ng).field_0.field_0.z = fVar102;
            ray->u = fVar125;
            ray->v = fVar101;
            ray->primID = uVar75;
            ray->geomID = uVar8;
            ray->instID[0] = context->user->instID[0];
            ray->instPrimID[0] = context->user->instPrimID[0];
          }
        }
      }
    }
LAB_01120c2d:
    auVar124 = ZEXT3264(local_580);
    if (8 < (int)local_660._0_4_) {
      local_5a0 = auVar210._0_32_;
      local_770 = uVar79;
      local_460._4_4_ = local_660._0_4_;
      local_460._0_4_ = local_660._0_4_;
      fStack_458 = (float)local_660._0_4_;
      fStack_454 = (float)local_660._0_4_;
      fStack_450 = (float)local_660._0_4_;
      fStack_44c = (float)local_660._0_4_;
      fStack_448 = (float)local_660._0_4_;
      iStack_444 = local_660._0_4_;
      local_300._4_4_ = fVar126;
      local_300._0_4_ = fVar126;
      fStack_2f8 = fVar126;
      fStack_2f4 = fVar126;
      fStack_2f0 = fVar126;
      fStack_2ec = fVar126;
      fStack_2e8 = fVar126;
      fStack_2e4 = fVar126;
      local_480 = (Geometry *)local_640._0_8_;
      uStack_478 = local_640._0_8_;
      uStack_470 = local_640._0_8_;
      uStack_468 = local_640._0_8_;
      local_100 = 1.0 / (float)local_3a0._0_4_;
      fStack_fc = local_100;
      fStack_f8 = local_100;
      fStack_f4 = local_100;
      fStack_f0 = local_100;
      fStack_ec = local_100;
      fStack_e8 = local_100;
      fStack_e4 = local_100;
      lVar84 = 8;
      local_620 = auVar144;
      _local_540 = auVar217._0_32_;
      local_1fc = local_660._0_4_;
      fVar126 = (float)local_500;
      fVar125 = local_500._4_4_;
      fVar101 = (float)uStack_4f8;
      fVar102 = uStack_4f8._4_4_;
      fVar103 = (float)uStack_4f0;
      fVar104 = uStack_4f0._4_4_;
      fVar105 = (float)uStack_4e8;
LAB_01120cf1:
      local_580 = auVar124._0_32_;
      if (lVar84 < iVar9) {
        auVar165 = *(undefined1 (*) [32])(bspline_basis0 + lVar84 * 4 + lVar81);
        local_740 = *(undefined1 (*) [32])(lVar81 + 0x21fffac + lVar84 * 4);
        auVar95 = *(undefined1 (*) [32])(lVar81 + 0x2200430 + lVar84 * 4);
        pauVar2 = (undefined1 (*) [28])(lVar81 + 0x22008b4 + lVar84 * 4);
        fVar106 = *(float *)*pauVar2;
        fVar191 = *(float *)(*pauVar2 + 4);
        fVar193 = *(float *)(*pauVar2 + 8);
        fVar195 = *(float *)(*pauVar2 + 0xc);
        fVar197 = *(float *)(*pauVar2 + 0x10);
        fVar199 = *(float *)(*pauVar2 + 0x14);
        fVar201 = *(float *)(*pauVar2 + 0x18);
        auVar73 = *pauVar2;
        auVar218._0_4_ = local_520 * fVar106;
        auVar218._4_4_ = fStack_51c * fVar191;
        auVar218._8_4_ = fStack_518 * fVar193;
        auVar218._12_4_ = fStack_514 * fVar195;
        auVar218._16_4_ = fStack_510 * fVar197;
        auVar218._20_4_ = fStack_50c * fVar199;
        auVar218._28_36_ = auVar217._28_36_;
        auVar218._24_4_ = fStack_508 * fVar201;
        auVar211._0_4_ = fVar126 * fVar106;
        auVar211._4_4_ = fVar125 * fVar191;
        auVar211._8_4_ = fVar101 * fVar193;
        auVar211._12_4_ = fVar102 * fVar195;
        auVar211._16_4_ = fVar103 * fVar197;
        auVar211._20_4_ = fVar104 * fVar199;
        auVar211._28_36_ = auVar210._28_36_;
        auVar211._24_4_ = fVar105 * fVar201;
        auVar151 = vfmadd231ps_fma(auVar218._0_32_,auVar95,local_4e0);
        auVar204 = auVar205._0_32_;
        auVar13 = vfmadd231ps_fma(auVar211._0_32_,auVar95,auVar204);
        auVar92 = auVar189._0_32_;
        auVar151 = vfmadd231ps_fma(ZEXT1632(auVar151),local_740,auVar92);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),local_740,local_3e0);
        auVar151 = vfmadd231ps_fma(ZEXT1632(auVar151),auVar165,auVar223._0_32_);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar165,local_3c0);
        auVar97 = *(undefined1 (*) [32])(bspline_basis1 + lVar84 * 4 + lVar81);
        auVar116 = *(undefined1 (*) [32])(lVar81 + 0x22023cc + lVar84 * 4);
        auVar139 = *(undefined1 (*) [32])(lVar81 + 0x2202850 + lVar84 * 4);
        pfVar3 = (float *)(lVar81 + 0x2202cd4 + lVar84 * 4);
        fVar68 = *pfVar3;
        fVar182 = pfVar3[1];
        fVar190 = pfVar3[2];
        fVar192 = pfVar3[3];
        fVar194 = pfVar3[4];
        fVar196 = pfVar3[5];
        fVar198 = pfVar3[6];
        auVar38._4_4_ = fVar182 * fStack_51c;
        auVar38._0_4_ = fVar68 * local_520;
        auVar38._8_4_ = fVar190 * fStack_518;
        auVar38._12_4_ = fVar192 * fStack_514;
        auVar38._16_4_ = fVar194 * fStack_510;
        auVar38._20_4_ = fVar196 * fStack_50c;
        auVar38._24_4_ = fVar198 * fStack_508;
        auVar38._28_4_ = local_3c0._28_4_;
        auVar39._4_4_ = fVar125 * fVar182;
        auVar39._0_4_ = fVar126 * fVar68;
        auVar39._8_4_ = fVar101 * fVar190;
        auVar39._12_4_ = fVar102 * fVar192;
        auVar39._16_4_ = fVar103 * fVar194;
        auVar39._20_4_ = fVar104 * fVar196;
        auVar39._24_4_ = fVar105 * fVar198;
        auVar39._28_4_ = fStack_504;
        auVar14 = vfmadd231ps_fma(auVar38,auVar139,local_4e0);
        auVar15 = vfmadd231ps_fma(auVar39,auVar139,auVar204);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar116,auVar92);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar116,local_3e0);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar97,auVar223._0_32_);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar97,local_3c0);
        auVar173 = ZEXT1632(auVar14);
        local_400 = ZEXT1632(auVar151);
        auVar96 = vsubps_avx(auVar173,local_400);
        local_640 = ZEXT1632(auVar15);
        local_420 = ZEXT1632(auVar13);
        local_2c0 = vsubps_avx(local_640,local_420);
        auVar40._4_4_ = auVar13._4_4_ * auVar96._4_4_;
        auVar40._0_4_ = auVar13._0_4_ * auVar96._0_4_;
        auVar40._8_4_ = auVar13._8_4_ * auVar96._8_4_;
        auVar40._12_4_ = auVar13._12_4_ * auVar96._12_4_;
        auVar40._16_4_ = auVar96._16_4_ * 0.0;
        auVar40._20_4_ = auVar96._20_4_ * 0.0;
        auVar40._24_4_ = auVar96._24_4_ * 0.0;
        auVar40._28_4_ = local_3c0._28_4_;
        fVar126 = local_2c0._0_4_;
        auVar119._0_4_ = auVar151._0_4_ * fVar126;
        fVar125 = local_2c0._4_4_;
        auVar119._4_4_ = auVar151._4_4_ * fVar125;
        fVar101 = local_2c0._8_4_;
        auVar119._8_4_ = auVar151._8_4_ * fVar101;
        fVar102 = local_2c0._12_4_;
        auVar119._12_4_ = auVar151._12_4_ * fVar102;
        fVar103 = local_2c0._16_4_;
        auVar119._16_4_ = fVar103 * 0.0;
        fVar104 = local_2c0._20_4_;
        auVar119._20_4_ = fVar104 * 0.0;
        fVar105 = local_2c0._24_4_;
        auVar119._24_4_ = fVar105 * 0.0;
        auVar119._28_4_ = 0;
        auVar12 = vsubps_avx(auVar40,auVar119);
        auVar174._0_4_ = (float)local_e0 * fVar106;
        auVar174._4_4_ = local_e0._4_4_ * fVar191;
        auVar174._8_4_ = (float)uStack_d8 * fVar193;
        auVar174._12_4_ = uStack_d8._4_4_ * fVar195;
        auVar174._16_4_ = (float)uStack_d0 * fVar197;
        auVar174._20_4_ = uStack_d0._4_4_ * fVar199;
        auVar174._24_4_ = (float)uStack_c8 * fVar201;
        auVar174._28_4_ = 0;
        auVar151 = vfmadd231ps_fma(auVar174,local_c0,auVar95);
        auVar151 = vfmadd231ps_fma(ZEXT1632(auVar151),local_a0,local_740);
        auVar210 = ZEXT3264(local_80);
        auVar151 = vfmadd231ps_fma(ZEXT1632(auVar151),local_80,auVar165);
        auVar41._4_4_ = local_e0._4_4_ * fVar182;
        auVar41._0_4_ = (float)local_e0 * fVar68;
        auVar41._8_4_ = (float)uStack_d8 * fVar190;
        auVar41._12_4_ = uStack_d8._4_4_ * fVar192;
        auVar41._16_4_ = (float)uStack_d0 * fVar194;
        auVar41._20_4_ = uStack_d0._4_4_ * fVar196;
        auVar41._24_4_ = (float)uStack_c8 * fVar198;
        auVar41._28_4_ = uStack_c8._4_4_;
        auVar13 = vfmadd231ps_fma(auVar41,auVar139,local_c0);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar116,local_a0);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar97,local_80);
        auVar217 = ZEXT1664(auVar13);
        auVar223._0_4_ = fVar126 * fVar126;
        auVar223._4_4_ = fVar125 * fVar125;
        auVar223._8_4_ = fVar101 * fVar101;
        auVar223._12_4_ = fVar102 * fVar102;
        auVar223._16_4_ = fVar103 * fVar103;
        auVar223._20_4_ = fVar104 * fVar104;
        auVar223._28_36_ = auVar189._28_36_;
        auVar223._24_4_ = fVar105 * fVar105;
        auVar14 = vfmadd231ps_fma(auVar223._0_32_,auVar96,auVar96);
        local_760 = ZEXT1632(auVar13);
        auVar138 = vmaxps_avx(ZEXT1632(auVar151),local_760);
        auVar186._0_4_ = auVar138._0_4_ * auVar138._0_4_ * auVar14._0_4_;
        auVar186._4_4_ = auVar138._4_4_ * auVar138._4_4_ * auVar14._4_4_;
        auVar186._8_4_ = auVar138._8_4_ * auVar138._8_4_ * auVar14._8_4_;
        auVar186._12_4_ = auVar138._12_4_ * auVar138._12_4_ * auVar14._12_4_;
        auVar186._16_4_ = auVar138._16_4_ * auVar138._16_4_ * 0.0;
        auVar186._20_4_ = auVar138._20_4_ * auVar138._20_4_ * 0.0;
        auVar186._24_4_ = auVar138._24_4_ * auVar138._24_4_ * 0.0;
        auVar186._28_4_ = 0;
        auVar42._4_4_ = auVar12._4_4_ * auVar12._4_4_;
        auVar42._0_4_ = auVar12._0_4_ * auVar12._0_4_;
        auVar42._8_4_ = auVar12._8_4_ * auVar12._8_4_;
        auVar42._12_4_ = auVar12._12_4_ * auVar12._12_4_;
        auVar42._16_4_ = auVar12._16_4_ * auVar12._16_4_;
        auVar42._20_4_ = auVar12._20_4_ * auVar12._20_4_;
        auVar42._24_4_ = auVar12._24_4_ * auVar12._24_4_;
        auVar42._28_4_ = auVar12._28_4_;
        auVar138 = vcmpps_avx(auVar42,auVar186,2);
        local_200 = (int)lVar84;
        auVar187._4_4_ = local_200;
        auVar187._0_4_ = local_200;
        auVar187._8_4_ = local_200;
        auVar187._12_4_ = local_200;
        auVar187._16_4_ = local_200;
        auVar187._20_4_ = local_200;
        auVar187._24_4_ = local_200;
        auVar187._28_4_ = local_200;
        auVar12 = vpor_avx2(auVar187,_DAT_01fb4ba0);
        auVar18 = vpcmpgtd_avx2(_local_460,auVar12);
        auVar12 = auVar18 & auVar138;
        fVar126 = (float)local_500;
        fVar125 = local_500._4_4_;
        fVar101 = (float)uStack_4f8;
        fVar102 = uStack_4f8._4_4_;
        fVar103 = (float)uStack_4f0;
        fVar104 = uStack_4f0._4_4_;
        fVar105 = (float)uStack_4e8;
        if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar12 >> 0x7f,0) != '\0') ||
              (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar12 >> 0xbf,0) != '\0') ||
            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar12[0x1f] < '\0') {
          local_3a0 = vandps_avx(auVar18,auVar138);
          auVar43._4_4_ = (float)local_540._4_4_ * fVar182;
          auVar43._0_4_ = (float)local_540._0_4_ * fVar68;
          auVar43._8_4_ = fStack_538 * fVar190;
          auVar43._12_4_ = fStack_534 * fVar192;
          auVar43._16_4_ = fStack_530 * fVar194;
          auVar43._20_4_ = fStack_52c * fVar196;
          auVar43._24_4_ = fStack_528 * fVar198;
          auVar43._28_4_ = auVar138._28_4_;
          auVar14 = vfmadd213ps_fma(auVar139,local_5a0,auVar43);
          auVar14 = vfmadd213ps_fma(auVar116,local_2a0,ZEXT1632(auVar14));
          auVar14 = vfmadd132ps_fma(auVar97,ZEXT1632(auVar14),local_620);
          local_2e0 = ZEXT1632(auVar14);
          local_440._0_4_ = auVar73._0_4_;
          local_440._4_4_ = auVar73._4_4_;
          fStack_438 = auVar73._8_4_;
          fStack_434 = auVar73._12_4_;
          fStack_430 = auVar73._16_4_;
          fStack_42c = auVar73._20_4_;
          fStack_428 = auVar73._24_4_;
          auVar44._4_4_ = (float)local_540._4_4_ * (float)local_440._4_4_;
          auVar44._0_4_ = (float)local_540._0_4_ * (float)local_440._0_4_;
          auVar44._8_4_ = fStack_538 * fStack_438;
          auVar44._12_4_ = fStack_534 * fStack_434;
          auVar44._16_4_ = fStack_530 * fStack_430;
          auVar44._20_4_ = fStack_52c * fStack_42c;
          auVar44._24_4_ = fStack_528 * fStack_428;
          auVar44._28_4_ = auVar138._28_4_;
          auVar14 = vfmadd213ps_fma(auVar95,local_5a0,auVar44);
          auVar14 = vfmadd213ps_fma(local_740,local_2a0,ZEXT1632(auVar14));
          auVar95 = *(undefined1 (*) [32])(lVar81 + 0x2200d38 + lVar84 * 4);
          auVar97 = *(undefined1 (*) [32])(lVar81 + 0x22011bc + lVar84 * 4);
          auVar116 = *(undefined1 (*) [32])(lVar81 + 0x2201640 + lVar84 * 4);
          pfVar3 = (float *)(lVar81 + 0x2201ac4 + lVar84 * 4);
          fVar106 = *pfVar3;
          fVar191 = pfVar3[1];
          fVar193 = pfVar3[2];
          fVar195 = pfVar3[3];
          fVar197 = pfVar3[4];
          fVar199 = pfVar3[5];
          fVar201 = pfVar3[6];
          auVar181._0_4_ = fVar106 * local_520;
          auVar181._4_4_ = fVar191 * fStack_51c;
          auVar181._8_4_ = fVar193 * fStack_518;
          auVar181._12_4_ = fVar195 * fStack_514;
          auVar181._16_4_ = fVar197 * fStack_510;
          auVar181._20_4_ = fVar199 * fStack_50c;
          auVar181._24_4_ = fVar201 * fStack_508;
          auVar181._28_4_ = 0;
          _local_440 = auVar96;
          auVar45._4_4_ = local_500._4_4_ * fVar191;
          auVar45._0_4_ = (float)local_500 * fVar106;
          auVar45._8_4_ = (float)uStack_4f8 * fVar193;
          auVar45._12_4_ = uStack_4f8._4_4_ * fVar195;
          auVar45._16_4_ = (float)uStack_4f0 * fVar197;
          auVar45._20_4_ = uStack_4f0._4_4_ * fVar199;
          auVar45._24_4_ = (float)uStack_4e8 * fVar201;
          auVar45._28_4_ = local_2c0._28_4_;
          auVar46._4_4_ = (float)local_540._4_4_ * fVar191;
          auVar46._0_4_ = (float)local_540._0_4_ * fVar106;
          auVar46._8_4_ = fStack_538 * fVar193;
          auVar46._12_4_ = fStack_534 * fVar195;
          auVar46._16_4_ = fStack_530 * fVar197;
          auVar46._20_4_ = fStack_52c * fVar199;
          auVar46._24_4_ = fStack_528 * fVar201;
          auVar46._28_4_ = pfVar3[7];
          auVar15 = vfmadd231ps_fma(auVar181,auVar116,local_4e0);
          auVar16 = vfmadd231ps_fma(auVar45,auVar116,auVar204);
          auVar17 = vfmadd231ps_fma(auVar46,local_5a0,auVar116);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar97,auVar92);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar97,local_3e0);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_2a0,auVar97);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar95,local_680);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar95,local_3c0);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar95,local_620);
          pfVar3 = (float *)(lVar81 + 0x2203ee4 + lVar84 * 4);
          fVar106 = *pfVar3;
          fVar191 = pfVar3[1];
          fVar193 = pfVar3[2];
          fVar195 = pfVar3[3];
          fVar197 = pfVar3[4];
          fVar199 = pfVar3[5];
          fVar201 = pfVar3[6];
          auVar47._4_4_ = fStack_51c * fVar191;
          auVar47._0_4_ = local_520 * fVar106;
          auVar47._8_4_ = fStack_518 * fVar193;
          auVar47._12_4_ = fStack_514 * fVar195;
          auVar47._16_4_ = fStack_510 * fVar197;
          auVar47._20_4_ = fStack_50c * fVar199;
          auVar47._24_4_ = fStack_508 * fVar201;
          auVar47._28_4_ = auVar96._28_4_;
          auVar48._4_4_ = local_500._4_4_ * fVar191;
          auVar48._0_4_ = (float)local_500 * fVar106;
          auVar48._8_4_ = (float)uStack_4f8 * fVar193;
          auVar48._12_4_ = uStack_4f8._4_4_ * fVar195;
          auVar48._16_4_ = (float)uStack_4f0 * fVar197;
          auVar48._20_4_ = uStack_4f0._4_4_ * fVar199;
          auVar48._24_4_ = (float)uStack_4e8 * fVar201;
          auVar48._28_4_ = uStack_4e8._4_4_;
          auVar49._4_4_ = fVar191 * (float)local_540._4_4_;
          auVar49._0_4_ = fVar106 * (float)local_540._0_4_;
          auVar49._8_4_ = fVar193 * fStack_538;
          auVar49._12_4_ = fVar195 * fStack_534;
          auVar49._16_4_ = fVar197 * fStack_530;
          auVar49._20_4_ = fVar199 * fStack_52c;
          auVar49._24_4_ = fVar201 * fStack_528;
          auVar49._28_4_ = pfVar3[7];
          auVar95 = *(undefined1 (*) [32])(lVar81 + 0x2203a60 + lVar84 * 4);
          auVar89 = vfmadd231ps_fma(auVar47,auVar95,local_4e0);
          auVar88 = vfmadd231ps_fma(auVar48,auVar95,auVar204);
          auVar127 = vfmadd231ps_fma(auVar49,auVar95,local_5a0);
          auVar95 = *(undefined1 (*) [32])(lVar81 + 0x22035dc + lVar84 * 4);
          auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar95,auVar92);
          auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar95,local_3e0);
          auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),local_2a0,auVar95);
          auVar95 = *(undefined1 (*) [32])(lVar81 + 0x2203158 + lVar84 * 4);
          auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar95,local_680);
          auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar95,local_3c0);
          auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),local_620,auVar95);
          auVar188._8_4_ = 0x7fffffff;
          auVar188._0_8_ = 0x7fffffff7fffffff;
          auVar188._12_4_ = 0x7fffffff;
          auVar188._16_4_ = 0x7fffffff;
          auVar188._20_4_ = 0x7fffffff;
          auVar188._24_4_ = 0x7fffffff;
          auVar188._28_4_ = 0x7fffffff;
          auVar95 = vandps_avx(ZEXT1632(auVar15),auVar188);
          auVar97 = vandps_avx(ZEXT1632(auVar16),auVar188);
          auVar97 = vmaxps_avx(auVar95,auVar97);
          auVar95 = vandps_avx(ZEXT1632(auVar17),auVar188);
          auVar95 = vmaxps_avx(auVar97,auVar95);
          auVar95 = vcmpps_avx(auVar95,_local_300,1);
          auVar116 = vblendvps_avx(ZEXT1632(auVar15),auVar96,auVar95);
          auVar139 = vblendvps_avx(ZEXT1632(auVar16),local_2c0,auVar95);
          auVar95 = vandps_avx(ZEXT1632(auVar89),auVar188);
          auVar97 = vandps_avx(ZEXT1632(auVar88),auVar188);
          auVar97 = vmaxps_avx(auVar95,auVar97);
          auVar95 = vandps_avx(auVar188,ZEXT1632(auVar127));
          auVar95 = vmaxps_avx(auVar97,auVar95);
          auVar97 = vcmpps_avx(auVar95,_local_300,1);
          auVar95 = vblendvps_avx(ZEXT1632(auVar89),auVar96,auVar97);
          auVar97 = vblendvps_avx(ZEXT1632(auVar88),local_2c0,auVar97);
          auVar14 = vfmadd213ps_fma(auVar165,local_620,ZEXT1632(auVar14));
          auVar15 = vfmadd213ps_fma(auVar116,auVar116,ZEXT832(0) << 0x20);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar139,auVar139);
          auVar165 = vrsqrtps_avx(ZEXT1632(auVar15));
          fVar106 = auVar165._0_4_;
          fVar191 = auVar165._4_4_;
          fVar193 = auVar165._8_4_;
          fVar195 = auVar165._12_4_;
          fVar197 = auVar165._16_4_;
          fVar199 = auVar165._20_4_;
          fVar201 = auVar165._24_4_;
          auVar50._4_4_ = fVar191 * fVar191 * fVar191 * auVar15._4_4_ * -0.5;
          auVar50._0_4_ = fVar106 * fVar106 * fVar106 * auVar15._0_4_ * -0.5;
          auVar50._8_4_ = fVar193 * fVar193 * fVar193 * auVar15._8_4_ * -0.5;
          auVar50._12_4_ = fVar195 * fVar195 * fVar195 * auVar15._12_4_ * -0.5;
          auVar50._16_4_ = fVar197 * fVar197 * fVar197 * -0.0;
          auVar50._20_4_ = fVar199 * fVar199 * fVar199 * -0.0;
          auVar50._24_4_ = fVar201 * fVar201 * fVar201 * -0.0;
          auVar50._28_4_ = 0;
          auVar222._8_4_ = 0x3fc00000;
          auVar222._0_8_ = 0x3fc000003fc00000;
          auVar222._12_4_ = 0x3fc00000;
          auVar222._16_4_ = 0x3fc00000;
          auVar222._20_4_ = 0x3fc00000;
          auVar222._24_4_ = 0x3fc00000;
          auVar222._28_4_ = 0x3fc00000;
          auVar15 = vfmadd231ps_fma(auVar50,auVar222,auVar165);
          fVar106 = auVar15._0_4_;
          fVar191 = auVar15._4_4_;
          auVar51._4_4_ = auVar139._4_4_ * fVar191;
          auVar51._0_4_ = auVar139._0_4_ * fVar106;
          fVar193 = auVar15._8_4_;
          auVar51._8_4_ = auVar139._8_4_ * fVar193;
          fVar195 = auVar15._12_4_;
          auVar51._12_4_ = auVar139._12_4_ * fVar195;
          auVar51._16_4_ = auVar139._16_4_ * 0.0;
          auVar51._20_4_ = auVar139._20_4_ * 0.0;
          auVar51._24_4_ = auVar139._24_4_ * 0.0;
          auVar51._28_4_ = auVar165._28_4_;
          auVar52._4_4_ = fVar191 * -auVar116._4_4_;
          auVar52._0_4_ = fVar106 * -auVar116._0_4_;
          auVar52._8_4_ = fVar193 * -auVar116._8_4_;
          auVar52._12_4_ = fVar195 * -auVar116._12_4_;
          auVar52._16_4_ = -auVar116._16_4_ * 0.0;
          auVar52._20_4_ = -auVar116._20_4_ * 0.0;
          auVar52._24_4_ = -auVar116._24_4_ * 0.0;
          auVar52._28_4_ = auVar139._28_4_;
          auVar15 = vfmadd213ps_fma(auVar95,auVar95,ZEXT832(0) << 0x20);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar97,auVar97);
          auVar165 = vrsqrtps_avx(ZEXT1632(auVar15));
          auVar53._28_4_ = local_680._28_4_;
          auVar53._0_28_ =
               ZEXT1628(CONCAT412(fVar195 * 0.0,
                                  CONCAT48(fVar193 * 0.0,CONCAT44(fVar191 * 0.0,fVar106 * 0.0))));
          fVar106 = auVar165._0_4_;
          fVar191 = auVar165._4_4_;
          fVar193 = auVar165._8_4_;
          fVar195 = auVar165._12_4_;
          fVar197 = auVar165._16_4_;
          fVar199 = auVar165._20_4_;
          fVar201 = auVar165._24_4_;
          auVar54._4_4_ = fVar191 * fVar191 * fVar191 * auVar15._4_4_ * -0.5;
          auVar54._0_4_ = fVar106 * fVar106 * fVar106 * auVar15._0_4_ * -0.5;
          auVar54._8_4_ = fVar193 * fVar193 * fVar193 * auVar15._8_4_ * -0.5;
          auVar54._12_4_ = fVar195 * fVar195 * fVar195 * auVar15._12_4_ * -0.5;
          auVar54._16_4_ = fVar197 * fVar197 * fVar197 * -0.0;
          auVar54._20_4_ = fVar199 * fVar199 * fVar199 * -0.0;
          auVar54._24_4_ = fVar201 * fVar201 * fVar201 * -0.0;
          auVar54._28_4_ = 0;
          auVar15 = vfmadd231ps_fma(auVar54,auVar222,auVar165);
          fVar106 = auVar15._0_4_;
          fVar191 = auVar15._4_4_;
          auVar55._4_4_ = auVar97._4_4_ * fVar191;
          auVar55._0_4_ = auVar97._0_4_ * fVar106;
          fVar193 = auVar15._8_4_;
          auVar55._8_4_ = auVar97._8_4_ * fVar193;
          fVar195 = auVar15._12_4_;
          auVar55._12_4_ = auVar97._12_4_ * fVar195;
          auVar55._16_4_ = auVar97._16_4_ * 0.0;
          auVar55._20_4_ = auVar97._20_4_ * 0.0;
          auVar55._24_4_ = auVar97._24_4_ * 0.0;
          auVar55._28_4_ = 0;
          auVar56._4_4_ = fVar191 * -auVar95._4_4_;
          auVar56._0_4_ = fVar106 * -auVar95._0_4_;
          auVar56._8_4_ = fVar193 * -auVar95._8_4_;
          auVar56._12_4_ = fVar195 * -auVar95._12_4_;
          auVar56._16_4_ = -auVar95._16_4_ * 0.0;
          auVar56._20_4_ = -auVar95._20_4_ * 0.0;
          auVar56._24_4_ = -auVar95._24_4_ * 0.0;
          auVar56._28_4_ = auVar165._28_4_;
          auVar57._28_4_ = 0xbf000000;
          auVar57._0_28_ =
               ZEXT1628(CONCAT412(fVar195 * 0.0,
                                  CONCAT48(fVar193 * 0.0,CONCAT44(fVar191 * 0.0,fVar106 * 0.0))));
          auVar15 = vfmadd213ps_fma(auVar51,ZEXT1632(auVar151),local_400);
          auVar165 = ZEXT1632(auVar151);
          auVar16 = vfmadd213ps_fma(auVar52,auVar165,local_420);
          auVar17 = vfmadd213ps_fma(auVar53,auVar165,ZEXT1632(auVar14));
          auVar87 = vfnmadd213ps_fma(auVar51,auVar165,local_400);
          auVar89 = vfmadd213ps_fma(auVar55,local_760,auVar173);
          auVar128 = vfnmadd213ps_fma(auVar52,auVar165,local_420);
          auVar88 = vfmadd213ps_fma(auVar56,local_760,local_640);
          local_740 = ZEXT1632(auVar151);
          auVar14 = vfnmadd231ps_fma(ZEXT1632(auVar14),local_740,auVar53);
          auVar127 = vfmadd213ps_fma(auVar57,local_760,local_2e0);
          auVar142 = vfnmadd213ps_fma(auVar55,local_760,auVar173);
          auVar148 = vfnmadd213ps_fma(auVar56,local_760,local_640);
          auVar86 = vfnmadd231ps_fma(local_2e0,local_760,auVar57);
          auVar165 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar128));
          auVar95 = vsubps_avx(ZEXT1632(auVar127),ZEXT1632(auVar14));
          auVar175._0_4_ = auVar165._0_4_ * auVar14._0_4_;
          auVar175._4_4_ = auVar165._4_4_ * auVar14._4_4_;
          auVar175._8_4_ = auVar165._8_4_ * auVar14._8_4_;
          auVar175._12_4_ = auVar165._12_4_ * auVar14._12_4_;
          auVar175._16_4_ = auVar165._16_4_ * 0.0;
          auVar175._20_4_ = auVar165._20_4_ * 0.0;
          auVar175._24_4_ = auVar165._24_4_ * 0.0;
          auVar175._28_4_ = 0;
          auVar108 = vfmsub231ps_fma(auVar175,ZEXT1632(auVar128),auVar95);
          auVar58._4_4_ = auVar87._4_4_ * auVar95._4_4_;
          auVar58._0_4_ = auVar87._0_4_ * auVar95._0_4_;
          auVar58._8_4_ = auVar87._8_4_ * auVar95._8_4_;
          auVar58._12_4_ = auVar87._12_4_ * auVar95._12_4_;
          auVar58._16_4_ = auVar95._16_4_ * 0.0;
          auVar58._20_4_ = auVar95._20_4_ * 0.0;
          auVar58._24_4_ = auVar95._24_4_ * 0.0;
          auVar58._28_4_ = auVar95._28_4_;
          auVar139 = ZEXT1632(auVar87);
          auVar95 = vsubps_avx(ZEXT1632(auVar89),auVar139);
          auVar96 = ZEXT1632(auVar14);
          auVar14 = vfmsub231ps_fma(auVar58,auVar96,auVar95);
          auVar59._4_4_ = auVar128._4_4_ * auVar95._4_4_;
          auVar59._0_4_ = auVar128._0_4_ * auVar95._0_4_;
          auVar59._8_4_ = auVar128._8_4_ * auVar95._8_4_;
          auVar59._12_4_ = auVar128._12_4_ * auVar95._12_4_;
          auVar59._16_4_ = auVar95._16_4_ * 0.0;
          auVar59._20_4_ = auVar95._20_4_ * 0.0;
          auVar59._24_4_ = auVar95._24_4_ * 0.0;
          auVar59._28_4_ = auVar95._28_4_;
          auVar87 = vfmsub231ps_fma(auVar59,auVar139,auVar165);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar87),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar108));
          auVar12 = vcmpps_avx(ZEXT1632(auVar14),ZEXT832(0) << 0x20,2);
          local_640 = vblendvps_avx(ZEXT1632(auVar142),ZEXT1632(auVar15),auVar12);
          local_660 = vblendvps_avx(ZEXT1632(auVar148),ZEXT1632(auVar16),auVar12);
          auVar165 = vblendvps_avx(ZEXT1632(auVar86),ZEXT1632(auVar17),auVar12);
          auVar95 = vblendvps_avx(auVar139,ZEXT1632(auVar89),auVar12);
          auVar97 = vblendvps_avx(ZEXT1632(auVar128),ZEXT1632(auVar88),auVar12);
          auVar116 = vblendvps_avx(auVar96,ZEXT1632(auVar127),auVar12);
          auVar139 = vblendvps_avx(ZEXT1632(auVar89),auVar139,auVar12);
          auVar138 = vblendvps_avx(ZEXT1632(auVar88),ZEXT1632(auVar128),auVar12);
          auVar14 = vpackssdw_avx(local_3a0._0_16_,local_3a0._16_16_);
          local_720 = ZEXT1632(auVar14);
          auVar96 = vblendvps_avx(ZEXT1632(auVar127),auVar96,auVar12);
          auVar139 = vsubps_avx(auVar139,local_640);
          auVar138 = vsubps_avx(auVar138,local_660);
          auVar18 = vsubps_avx(auVar96,auVar165);
          auVar173 = vsubps_avx(local_640,auVar95);
          auVar92 = vsubps_avx(local_660,auVar97);
          auVar204 = vsubps_avx(auVar165,auVar116);
          auVar217 = ZEXT3264(auVar204);
          auVar166._0_4_ = auVar18._0_4_ * local_640._0_4_;
          auVar166._4_4_ = auVar18._4_4_ * local_640._4_4_;
          auVar166._8_4_ = auVar18._8_4_ * local_640._8_4_;
          auVar166._12_4_ = auVar18._12_4_ * local_640._12_4_;
          auVar166._16_4_ = auVar18._16_4_ * local_640._16_4_;
          auVar166._20_4_ = auVar18._20_4_ * local_640._20_4_;
          auVar166._24_4_ = auVar18._24_4_ * local_640._24_4_;
          auVar166._28_4_ = 0;
          auVar15 = vfmsub231ps_fma(auVar166,auVar165,auVar139);
          auVar60._4_4_ = auVar139._4_4_ * local_660._4_4_;
          auVar60._0_4_ = auVar139._0_4_ * local_660._0_4_;
          auVar60._8_4_ = auVar139._8_4_ * local_660._8_4_;
          auVar60._12_4_ = auVar139._12_4_ * local_660._12_4_;
          auVar60._16_4_ = auVar139._16_4_ * local_660._16_4_;
          auVar60._20_4_ = auVar139._20_4_ * local_660._20_4_;
          auVar60._24_4_ = auVar139._24_4_ * local_660._24_4_;
          auVar60._28_4_ = auVar96._28_4_;
          auVar16 = vfmsub231ps_fma(auVar60,local_640,auVar138);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
          auVar167._0_4_ = auVar165._0_4_ * auVar138._0_4_;
          auVar167._4_4_ = auVar165._4_4_ * auVar138._4_4_;
          auVar167._8_4_ = auVar165._8_4_ * auVar138._8_4_;
          auVar167._12_4_ = auVar165._12_4_ * auVar138._12_4_;
          auVar167._16_4_ = auVar165._16_4_ * auVar138._16_4_;
          auVar167._20_4_ = auVar165._20_4_ * auVar138._20_4_;
          auVar167._24_4_ = auVar165._24_4_ * auVar138._24_4_;
          auVar167._28_4_ = 0;
          auVar16 = vfmsub231ps_fma(auVar167,local_660,auVar18);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
          auVar168._0_4_ = auVar204._0_4_ * auVar95._0_4_;
          auVar168._4_4_ = auVar204._4_4_ * auVar95._4_4_;
          auVar168._8_4_ = auVar204._8_4_ * auVar95._8_4_;
          auVar168._12_4_ = auVar204._12_4_ * auVar95._12_4_;
          auVar168._16_4_ = auVar204._16_4_ * auVar95._16_4_;
          auVar168._20_4_ = auVar204._20_4_ * auVar95._20_4_;
          auVar168._24_4_ = auVar204._24_4_ * auVar95._24_4_;
          auVar168._28_4_ = 0;
          auVar15 = vfmsub231ps_fma(auVar168,auVar173,auVar116);
          auVar61._4_4_ = auVar92._4_4_ * auVar116._4_4_;
          auVar61._0_4_ = auVar92._0_4_ * auVar116._0_4_;
          auVar61._8_4_ = auVar92._8_4_ * auVar116._8_4_;
          auVar61._12_4_ = auVar92._12_4_ * auVar116._12_4_;
          auVar61._16_4_ = auVar92._16_4_ * auVar116._16_4_;
          auVar61._20_4_ = auVar92._20_4_ * auVar116._20_4_;
          auVar61._24_4_ = auVar92._24_4_ * auVar116._24_4_;
          auVar61._28_4_ = auVar116._28_4_;
          auVar17 = vfmsub231ps_fma(auVar61,auVar97,auVar204);
          auVar62._4_4_ = auVar173._4_4_ * auVar97._4_4_;
          auVar62._0_4_ = auVar173._0_4_ * auVar97._0_4_;
          auVar62._8_4_ = auVar173._8_4_ * auVar97._8_4_;
          auVar62._12_4_ = auVar173._12_4_ * auVar97._12_4_;
          auVar62._16_4_ = auVar173._16_4_ * auVar97._16_4_;
          auVar62._20_4_ = auVar173._20_4_ * auVar97._20_4_;
          auVar62._24_4_ = auVar173._24_4_ * auVar97._24_4_;
          auVar62._28_4_ = auVar97._28_4_;
          auVar89 = vfmsub231ps_fma(auVar62,auVar92,auVar95);
          auVar97 = ZEXT832(0) << 0x20;
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar97,ZEXT1632(auVar15));
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar97,ZEXT1632(auVar17));
          auVar95 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar17));
          auVar95 = vcmpps_avx(auVar95,auVar97,2);
          auVar15 = vpackssdw_avx(auVar95._0_16_,auVar95._16_16_);
          auVar14 = vpand_avx(auVar15,auVar14);
          auVar95 = vpmovsxwd_avx2(auVar14);
          if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar95 >> 0x7f,0) == '\0') &&
                (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar95 >> 0xbf,0) == '\0') &&
              (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar95[0x1f]) {
LAB_011217fa:
            auVar146._8_8_ = local_4c0[1]._8_8_;
            auVar146._0_8_ = local_4c0[1]._0_8_;
            auVar146._16_8_ = local_4c0[1]._16_8_;
            auVar146._24_8_ = local_4c0[1]._24_8_;
          }
          else {
            auVar63._4_4_ = auVar204._4_4_ * auVar138._4_4_;
            auVar63._0_4_ = auVar204._0_4_ * auVar138._0_4_;
            auVar63._8_4_ = auVar204._8_4_ * auVar138._8_4_;
            auVar63._12_4_ = auVar204._12_4_ * auVar138._12_4_;
            auVar63._16_4_ = auVar204._16_4_ * auVar138._16_4_;
            auVar63._20_4_ = auVar204._20_4_ * auVar138._20_4_;
            auVar63._24_4_ = auVar204._24_4_ * auVar138._24_4_;
            auVar63._28_4_ = auVar95._28_4_;
            auVar127 = vfmsub231ps_fma(auVar63,auVar92,auVar18);
            auVar176._0_4_ = auVar18._0_4_ * auVar173._0_4_;
            auVar176._4_4_ = auVar18._4_4_ * auVar173._4_4_;
            auVar176._8_4_ = auVar18._8_4_ * auVar173._8_4_;
            auVar176._12_4_ = auVar18._12_4_ * auVar173._12_4_;
            auVar176._16_4_ = auVar18._16_4_ * auVar173._16_4_;
            auVar176._20_4_ = auVar18._20_4_ * auVar173._20_4_;
            auVar176._24_4_ = auVar18._24_4_ * auVar173._24_4_;
            auVar176._28_4_ = 0;
            auVar88 = vfmsub231ps_fma(auVar176,auVar139,auVar204);
            auVar64._4_4_ = auVar139._4_4_ * auVar92._4_4_;
            auVar64._0_4_ = auVar139._0_4_ * auVar92._0_4_;
            auVar64._8_4_ = auVar139._8_4_ * auVar92._8_4_;
            auVar64._12_4_ = auVar139._12_4_ * auVar92._12_4_;
            auVar64._16_4_ = auVar139._16_4_ * auVar92._16_4_;
            auVar64._20_4_ = auVar139._20_4_ * auVar92._20_4_;
            auVar64._24_4_ = auVar139._24_4_ * auVar92._24_4_;
            auVar64._28_4_ = auVar92._28_4_;
            auVar108 = vfmsub231ps_fma(auVar64,auVar173,auVar138);
            auVar15 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar88),ZEXT1632(auVar108));
            auVar89 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632(auVar127),auVar97);
            auVar95 = vrcpps_avx(ZEXT1632(auVar89));
            auVar215._8_4_ = 0x3f800000;
            auVar215._0_8_ = 0x3f8000003f800000;
            auVar215._12_4_ = 0x3f800000;
            auVar215._16_4_ = 0x3f800000;
            auVar215._20_4_ = 0x3f800000;
            auVar215._24_4_ = 0x3f800000;
            auVar215._28_4_ = 0x3f800000;
            auVar15 = vfnmadd213ps_fma(auVar95,ZEXT1632(auVar89),auVar215);
            auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar95,auVar95);
            auVar65._4_4_ = auVar108._4_4_ * auVar165._4_4_;
            auVar65._0_4_ = auVar108._0_4_ * auVar165._0_4_;
            auVar65._8_4_ = auVar108._8_4_ * auVar165._8_4_;
            auVar65._12_4_ = auVar108._12_4_ * auVar165._12_4_;
            auVar65._16_4_ = auVar165._16_4_ * 0.0;
            auVar65._20_4_ = auVar165._20_4_ * 0.0;
            auVar65._24_4_ = auVar165._24_4_ * 0.0;
            auVar65._28_4_ = auVar165._28_4_;
            auVar88 = vfmadd231ps_fma(auVar65,ZEXT1632(auVar88),local_660);
            auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),ZEXT1632(auVar127),local_640);
            fVar191 = auVar15._0_4_;
            fVar193 = auVar15._4_4_;
            fVar195 = auVar15._8_4_;
            fVar197 = auVar15._12_4_;
            auVar97 = ZEXT1632(CONCAT412(auVar88._12_4_ * fVar197,
                                         CONCAT48(auVar88._8_4_ * fVar195,
                                                  CONCAT44(auVar88._4_4_ * fVar193,
                                                           auVar88._0_4_ * fVar191))));
            fVar106 = (ray->super_RayK<1>).tfar;
            auVar145._4_4_ = fVar106;
            auVar145._0_4_ = fVar106;
            auVar145._8_4_ = fVar106;
            auVar145._12_4_ = fVar106;
            auVar145._16_4_ = fVar106;
            auVar145._20_4_ = fVar106;
            auVar145._24_4_ = fVar106;
            auVar145._28_4_ = fVar106;
            auVar72._8_8_ = uStack_478;
            auVar72._0_8_ = local_480;
            auVar72._16_8_ = uStack_470;
            auVar72._24_8_ = uStack_468;
            auVar165 = vcmpps_avx(auVar72,auVar97,2);
            auVar95 = vcmpps_avx(auVar97,auVar145,2);
            auVar165 = vandps_avx(auVar95,auVar165);
            auVar15 = vpackssdw_avx(auVar165._0_16_,auVar165._16_16_);
            auVar14 = vpand_avx(auVar14,auVar15);
            auVar165 = vpmovsxwd_avx2(auVar14);
            if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar165 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar165 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar165 >> 0x7f,0) == '\0') &&
                  (auVar165 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar165 >> 0xbf,0) == '\0') &&
                (auVar165 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar165[0x1f]) goto LAB_011217fa;
            auVar165 = vcmpps_avx(ZEXT1632(auVar89),ZEXT832(0) << 0x20,4);
            auVar15 = vpackssdw_avx(auVar165._0_16_,auVar165._16_16_);
            auVar14 = vpand_avx(auVar14,auVar15);
            auVar165 = vpmovsxwd_avx2(auVar14);
            auVar146._8_8_ = local_4c0[1]._8_8_;
            auVar146._0_8_ = local_4c0[1]._0_8_;
            auVar146._16_8_ = local_4c0[1]._16_8_;
            auVar146._24_8_ = local_4c0[1]._24_8_;
            if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar165 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar165 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar165 >> 0x7f,0) != '\0') ||
                  (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar165 >> 0xbf,0) != '\0') ||
                (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar165[0x1f] < '\0') {
              auVar116 = ZEXT1632(CONCAT412(auVar16._12_4_ * fVar197,
                                            CONCAT48(auVar16._8_4_ * fVar195,
                                                     CONCAT44(auVar16._4_4_ * fVar193,
                                                              auVar16._0_4_ * fVar191))));
              auVar66._28_4_ = SUB84(local_4c0[1]._24_8_,4);
              auVar66._0_28_ =
                   ZEXT1628(CONCAT412(auVar17._12_4_ * fVar197,
                                      CONCAT48(auVar17._8_4_ * fVar195,
                                               CONCAT44(auVar17._4_4_ * fVar193,
                                                        auVar17._0_4_ * fVar191))));
              auVar98._8_4_ = 0x3f800000;
              auVar98._0_8_ = 0x3f8000003f800000;
              auVar98._12_4_ = 0x3f800000;
              auVar98._16_4_ = 0x3f800000;
              auVar98._20_4_ = 0x3f800000;
              auVar98._24_4_ = 0x3f800000;
              auVar98._28_4_ = 0x3f800000;
              auVar95 = vsubps_avx(auVar98,auVar116);
              local_580 = vblendvps_avx(auVar95,auVar116,auVar12);
              auVar95 = vsubps_avx(auVar98,auVar66);
              local_380 = vblendvps_avx(auVar95,auVar66,auVar12);
              local_360 = auVar97;
              auVar146 = auVar165;
            }
          }
          auVar223 = ZEXT3264(local_680);
          auVar210 = ZEXT3264(local_740);
          auVar205 = ZEXT3264(local_600);
          auVar189 = ZEXT3264(local_560);
          if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar146 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar146 >> 0x7f,0) != '\0') ||
                (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar146 >> 0xbf,0) != '\0') ||
              (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar146[0x1f] < '\0') {
            auVar165 = vsubps_avx(local_760,local_740);
            auVar14 = vfmadd213ps_fma(auVar165,local_580,local_740);
            fVar106 = pre->depth_scale;
            auVar67._4_4_ = (auVar14._4_4_ + auVar14._4_4_) * fVar106;
            auVar67._0_4_ = (auVar14._0_4_ + auVar14._0_4_) * fVar106;
            auVar67._8_4_ = (auVar14._8_4_ + auVar14._8_4_) * fVar106;
            auVar67._12_4_ = (auVar14._12_4_ + auVar14._12_4_) * fVar106;
            auVar67._16_4_ = fVar106 * 0.0;
            auVar67._20_4_ = fVar106 * 0.0;
            auVar67._24_4_ = fVar106 * 0.0;
            auVar67._28_4_ = fVar106;
            auVar165 = vcmpps_avx(local_360,auVar67,6);
            auVar95 = auVar146 & auVar165;
            if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar95 >> 0x7f,0) != '\0') ||
                  (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar95 >> 0xbf,0) != '\0') ||
                (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar95[0x1f] < '\0') {
              auVar120._8_4_ = 0xbf800000;
              auVar120._0_8_ = 0xbf800000bf800000;
              auVar120._12_4_ = 0xbf800000;
              auVar120._16_4_ = 0xbf800000;
              auVar120._20_4_ = 0xbf800000;
              auVar120._24_4_ = 0xbf800000;
              auVar120._28_4_ = 0xbf800000;
              auVar141._8_4_ = 0x40000000;
              auVar141._0_8_ = 0x4000000040000000;
              auVar141._12_4_ = 0x40000000;
              auVar141._16_4_ = 0x40000000;
              auVar141._20_4_ = 0x40000000;
              auVar141._24_4_ = 0x40000000;
              auVar141._28_4_ = 0x40000000;
              auVar14 = vfmadd213ps_fma(local_380,auVar141,auVar120);
              local_260 = local_580;
              local_380 = ZEXT1632(auVar14);
              auVar95 = local_380;
              local_240 = ZEXT1632(auVar14);
              local_220 = local_360;
              local_1f0 = local_700;
              uStack_1e8 = uStack_6f8;
              local_1e0 = local_6d0._0_8_;
              uStack_1d8 = local_6d0._8_8_;
              local_1d0 = local_6e0._0_8_;
              uStack_1c8 = local_6e0._8_8_;
              local_1c0 = local_6f0;
              uStack_1b8 = uStack_6e8;
              pGVar10 = (context->scene->geometries).items[local_770].ptr;
              local_740 = ZEXT1632(CONCAT88(auVar151._8_8_,pGVar10));
              auVar124 = ZEXT3264(local_580);
              if ((pGVar10->mask & (ray->super_RayK<1>).mask) == 0) goto LAB_01121531;
              auVar165 = vandps_avx(auVar165,auVar146);
              local_4c0[0] = auVar165;
              fVar126 = (float)local_200;
              local_180[0] = (fVar126 + local_580._0_4_ + 0.0) * local_100;
              local_180[1] = (fVar126 + local_580._4_4_ + 1.0) * fStack_fc;
              local_180[2] = (fVar126 + local_580._8_4_ + 2.0) * fStack_f8;
              local_180[3] = (fVar126 + local_580._12_4_ + 3.0) * fStack_f4;
              fStack_170 = (fVar126 + local_580._16_4_ + 4.0) * fStack_f0;
              fStack_16c = (fVar126 + local_580._20_4_ + 5.0) * fStack_ec;
              fStack_168 = (fVar126 + local_580._24_4_ + 6.0) * fStack_e8;
              fStack_164 = fVar126 + local_580._28_4_ + 7.0;
              local_380._0_8_ = auVar14._0_8_;
              local_380._8_8_ = auVar14._8_8_;
              local_160 = local_380._0_8_;
              uStack_158 = local_380._8_8_;
              uStack_150 = 0;
              uStack_148 = 0;
              local_140 = local_360;
              auVar121._8_4_ = 0x7f800000;
              auVar121._0_8_ = 0x7f8000007f800000;
              auVar121._12_4_ = 0x7f800000;
              auVar121._16_4_ = 0x7f800000;
              auVar121._20_4_ = 0x7f800000;
              auVar121._24_4_ = 0x7f800000;
              auVar121._28_4_ = 0x7f800000;
              auVar97 = vblendvps_avx(auVar121,local_360,auVar165);
              auVar116 = vshufps_avx(auVar97,auVar97,0xb1);
              auVar116 = vminps_avx(auVar97,auVar116);
              auVar139 = vshufpd_avx(auVar116,auVar116,5);
              auVar116 = vminps_avx(auVar116,auVar139);
              auVar139 = vpermpd_avx2(auVar116,0x4e);
              auVar116 = vminps_avx(auVar116,auVar139);
              auVar97 = vcmpps_avx(auVar97,auVar116,0);
              auVar116 = auVar165 & auVar97;
              if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar116 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar116 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar116 >> 0x7f,0) != '\0') ||
                    (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar116 >> 0xbf,0) != '\0') ||
                  (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar116[0x1f] < '\0') {
                auVar165 = vandps_avx(auVar97,auVar165);
              }
              uVar76 = vmovmskps_avx(auVar165);
              uVar8 = 0;
              for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000) {
                uVar8 = uVar8 + 1;
              }
              uVar79 = (ulong)uVar8;
              local_380 = auVar95;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                local_660._0_4_ = local_1fc;
                local_640._0_8_ = pPVar80;
                local_760 = ZEXT1632(CONCAT88(auVar13._8_8_,prim));
                local_720 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                local_5a8 = ray;
                do {
                  local_5d4 = local_180[uVar79];
                  local_5d0 = *(undefined4 *)((long)&local_160 + uVar79 * 4);
                  (ray->super_RayK<1>).tfar = *(float *)(local_140 + uVar79 * 4);
                  local_6b0.context = context->user;
                  fVar126 = 1.0 - local_5d4;
                  auVar151 = ZEXT416((uint)(local_5d4 * fVar126 * 4.0));
                  auVar13 = vfnmsub213ss_fma(ZEXT416((uint)local_5d4),ZEXT416((uint)local_5d4),
                                             auVar151);
                  auVar151 = vfmadd213ss_fma(ZEXT416((uint)fVar126),ZEXT416((uint)fVar126),auVar151)
                  ;
                  fVar126 = fVar126 * -fVar126 * 0.5;
                  fVar125 = auVar13._0_4_ * 0.5;
                  fVar101 = auVar151._0_4_ * 0.5;
                  fVar102 = local_5d4 * local_5d4 * 0.5;
                  auVar154._0_4_ = fVar102 * (float)local_6f0._0_4_;
                  auVar154._4_4_ = fVar102 * (float)local_6f0._4_4_;
                  auVar154._8_4_ = fVar102 * (float)uStack_6e8;
                  auVar154._12_4_ = fVar102 * uStack_6e8._4_4_;
                  auVar133._4_4_ = fVar101;
                  auVar133._0_4_ = fVar101;
                  auVar133._8_4_ = fVar101;
                  auVar133._12_4_ = fVar101;
                  auVar151 = vfmadd132ps_fma(auVar133,auVar154,local_6e0);
                  auVar155._4_4_ = fVar125;
                  auVar155._0_4_ = fVar125;
                  auVar155._8_4_ = fVar125;
                  auVar155._12_4_ = fVar125;
                  auVar151 = vfmadd132ps_fma(auVar155,auVar151,local_6d0);
                  auVar134._4_4_ = fVar126;
                  auVar134._0_4_ = fVar126;
                  auVar134._8_4_ = fVar126;
                  auVar134._12_4_ = fVar126;
                  auVar70._8_8_ = uStack_6f8;
                  auVar70._0_8_ = local_700;
                  auVar151 = vfmadd132ps_fma(auVar134,auVar151,auVar70);
                  local_5e0 = vmovlps_avx(auVar151);
                  local_5d8 = vextractps_avx(auVar151,2);
                  local_5cc = uVar75;
                  local_5c8 = (int)local_770;
                  local_5c4 = (local_6b0.context)->instID[0];
                  local_5c0 = (local_6b0.context)->instPrimID[0];
                  local_774 = -1;
                  local_6b0.valid = &local_774;
                  local_6b0.geometryUserPtr = *(void **)(local_740._0_8_ + 0x18);
                  local_6b0.ray = (RTCRayN *)ray;
                  local_6b0.hit = (RTCHitN *)&local_5e0;
                  local_6b0.N = 1;
                  if (*(code **)(local_740._0_8_ + 0x40) == (code *)0x0) {
LAB_011219c8:
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(local_740._0_8_ + 0x3e) & 0x40) != 0)))) {
                      auVar210 = ZEXT1664(auVar210._0_16_);
                      auVar217 = ZEXT1664(auVar217._0_16_);
                      (*p_Var11)(&local_6b0);
                      ray = local_5a8;
                      if (*local_6b0.valid == 0) goto LAB_01121a67;
                    }
                    (((Vec3f *)((long)local_6b0.ray + 0x30))->field_0).components[0] =
                         *(float *)local_6b0.hit;
                    (((Vec3f *)((long)local_6b0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_6b0.hit + 4);
                    (((Vec3f *)((long)local_6b0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_6b0.hit + 8);
                    *(float *)((long)local_6b0.ray + 0x3c) = *(float *)(local_6b0.hit + 0xc);
                    *(float *)((long)local_6b0.ray + 0x40) = *(float *)(local_6b0.hit + 0x10);
                    *(float *)((long)local_6b0.ray + 0x44) = *(float *)(local_6b0.hit + 0x14);
                    *(float *)((long)local_6b0.ray + 0x48) = *(float *)(local_6b0.hit + 0x18);
                    *(float *)((long)local_6b0.ray + 0x4c) = *(float *)(local_6b0.hit + 0x1c);
                    *(float *)((long)local_6b0.ray + 0x50) = *(float *)(local_6b0.hit + 0x20);
                  }
                  else {
                    auVar210 = ZEXT1664(auVar210._0_16_);
                    auVar217 = ZEXT1664(auVar217._0_16_);
                    (**(code **)(local_740._0_8_ + 0x40))(&local_6b0);
                    ray = local_5a8;
                    if (*local_6b0.valid != 0) goto LAB_011219c8;
LAB_01121a67:
                    (local_5a8->super_RayK<1>).tfar = (float)local_720._0_4_;
                    ray = local_5a8;
                  }
                  *(undefined4 *)(local_4c0[0] + uVar79 * 4) = 0;
                  auVar97 = local_4c0[0];
                  fVar126 = (ray->super_RayK<1>).tfar;
                  auVar99._4_4_ = fVar126;
                  auVar99._0_4_ = fVar126;
                  auVar99._8_4_ = fVar126;
                  auVar99._12_4_ = fVar126;
                  auVar99._16_4_ = fVar126;
                  auVar99._20_4_ = fVar126;
                  auVar99._24_4_ = fVar126;
                  auVar99._28_4_ = fVar126;
                  auVar95 = vcmpps_avx(local_360,auVar99,2);
                  auVar165 = vandps_avx(auVar95,local_4c0[0]);
                  local_4c0[0] = auVar165;
                  auVar97 = auVar97 & auVar95;
                  if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar97 >> 0x7f,0) == '\0') &&
                        (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar97 >> 0xbf,0) == '\0') &&
                      (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar97[0x1f]) goto LAB_01121b04;
                  auVar122._8_4_ = 0x7f800000;
                  auVar122._0_8_ = 0x7f8000007f800000;
                  auVar122._12_4_ = 0x7f800000;
                  auVar122._16_4_ = 0x7f800000;
                  auVar122._20_4_ = 0x7f800000;
                  auVar122._24_4_ = 0x7f800000;
                  auVar122._28_4_ = 0x7f800000;
                  auVar95 = vblendvps_avx(auVar122,local_360,auVar165);
                  auVar97 = vshufps_avx(auVar95,auVar95,0xb1);
                  auVar97 = vminps_avx(auVar95,auVar97);
                  auVar116 = vshufpd_avx(auVar97,auVar97,5);
                  auVar97 = vminps_avx(auVar97,auVar116);
                  auVar116 = vpermpd_avx2(auVar97,0x4e);
                  auVar97 = vminps_avx(auVar97,auVar116);
                  auVar95 = vcmpps_avx(auVar95,auVar97,0);
                  auVar97 = auVar165 & auVar95;
                  if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar97 >> 0x7f,0) != '\0') ||
                        (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar97 >> 0xbf,0) != '\0') ||
                      (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar97[0x1f] < '\0') {
                    auVar165 = vandps_avx(auVar95,auVar165);
                  }
                  local_720 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                  uVar76 = vmovmskps_avx(auVar165);
                  uVar8 = 0;
                  for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000) {
                    uVar8 = uVar8 + 1;
                  }
                  uVar79 = (ulong)uVar8;
                } while( true );
              }
              fVar126 = local_180[uVar79];
              fVar125 = *(float *)((long)&local_160 + uVar79 * 4);
              fVar101 = 1.0 - fVar126;
              auVar151 = ZEXT416((uint)(fVar126 * fVar101 * 4.0));
              auVar13 = vfnmsub213ss_fma(ZEXT416((uint)fVar126),ZEXT416((uint)fVar126),auVar151);
              auVar151 = vfmadd213ss_fma(ZEXT416((uint)fVar101),ZEXT416((uint)fVar101),auVar151);
              fVar101 = fVar101 * -fVar101 * 0.5;
              fVar102 = auVar13._0_4_ * 0.5;
              fVar103 = auVar151._0_4_ * 0.5;
              fVar104 = fVar126 * fVar126 * 0.5;
              auVar152._0_4_ = fVar104 * (float)local_6f0._0_4_;
              auVar152._4_4_ = fVar104 * (float)local_6f0._4_4_;
              auVar152._8_4_ = fVar104 * (float)uStack_6e8;
              auVar152._12_4_ = fVar104 * uStack_6e8._4_4_;
              auVar131._4_4_ = fVar103;
              auVar131._0_4_ = fVar103;
              auVar131._8_4_ = fVar103;
              auVar131._12_4_ = fVar103;
              auVar151 = vfmadd132ps_fma(auVar131,auVar152,local_6e0);
              auVar153._4_4_ = fVar102;
              auVar153._0_4_ = fVar102;
              auVar153._8_4_ = fVar102;
              auVar153._12_4_ = fVar102;
              auVar151 = vfmadd132ps_fma(auVar153,auVar151,local_6d0);
              auVar132._4_4_ = fVar101;
              auVar132._0_4_ = fVar101;
              auVar132._8_4_ = fVar101;
              auVar132._12_4_ = fVar101;
              auVar69._8_8_ = uStack_6f8;
              auVar69._0_8_ = local_700;
              auVar151 = vfmadd132ps_fma(auVar132,auVar151,auVar69);
              (ray->super_RayK<1>).tfar = *(float *)(local_140 + uVar79 * 4);
              uVar85 = vmovlps_avx(auVar151);
              *(undefined8 *)&(ray->Ng).field_0 = uVar85;
              fVar101 = (float)vextractps_avx(auVar151,2);
              (ray->Ng).field_0.field_0.z = fVar101;
              ray->u = fVar126;
              ray->v = fVar125;
              ray->primID = uVar75;
              ray->geomID = (uint)local_770;
              ray->instID[0] = context->user->instID[0];
              ray->instPrimID[0] = context->user->instPrimID[0];
            }
          }
          goto LAB_0112151f;
        }
        auVar124 = ZEXT3264(auVar124._0_32_);
        auVar205 = ZEXT3264(auVar204);
        auVar189 = ZEXT3264(auVar92);
        auVar223 = ZEXT3264(local_680);
        goto LAB_01121531;
      }
    }
    fVar126 = (ray->super_RayK<1>).tfar;
    auVar90._4_4_ = fVar126;
    auVar90._0_4_ = fVar126;
    auVar90._8_4_ = fVar126;
    auVar90._12_4_ = fVar126;
    auVar151 = vcmpps_avx(local_280,auVar90,2);
    uVar75 = vmovmskps_avx(auVar151);
    uVar83 = (ulong)((uint)uVar83 & uVar75);
  } while( true );
LAB_01121b04:
  auVar205 = ZEXT3264(local_600);
  auVar189 = ZEXT3264(local_560);
  auVar223 = ZEXT3264(local_680);
  pre = local_6b8;
  prim = (Primitive *)local_760._0_8_;
  pPVar80 = (Primitive *)local_640._0_8_;
  local_1fc = local_660._0_4_;
LAB_0112151f:
  auVar124 = ZEXT3264(local_580);
  fVar126 = (float)local_500;
  fVar125 = local_500._4_4_;
  fVar101 = (float)uStack_4f8;
  fVar102 = uStack_4f8._4_4_;
  fVar103 = (float)uStack_4f0;
  fVar104 = uStack_4f0._4_4_;
  fVar105 = (float)uStack_4e8;
LAB_01121531:
  lVar84 = lVar84 + 8;
  goto LAB_01120cf1;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }